

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

void embree::avx2::CurveNiIntersector1<4>::
     intersect_n<embree::avx2::OrientedCurve1Intersector1<embree::CatmullRomCurveT,7,8>,embree::avx2::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  Primitive PVar4;
  Geometry *pGVar5;
  RTCFilterFunctionN p_Var6;
  void *pvVar7;
  __int_type_conflict _Var8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  int iVar18;
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  bool bVar45;
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  uint uVar54;
  uint uVar55;
  uint uVar56;
  ulong uVar57;
  long lVar59;
  ulong uVar60;
  byte bVar61;
  uint uVar62;
  ulong uVar63;
  undefined4 uVar64;
  float fVar65;
  vint4 bi_2;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [32];
  float fVar83;
  vint4 bi_1;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar88 [16];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar101 [16];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  float fVar113;
  float fVar126;
  float fVar127;
  vint4 ai_2;
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  float fVar128;
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  vint4 ai;
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar163;
  float fVar165;
  vint4 bi;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  float fVar167;
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  float fVar164;
  float fVar166;
  float fVar168;
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [32];
  undefined8 uVar169;
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  float fVar184;
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  float fVar185;
  float fVar186;
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [32];
  vint4 ai_1;
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar207 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [32];
  vfloat4 a0_3;
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [32];
  float fVar227;
  float fVar238;
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  vfloat4 a0_1;
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [32];
  float fVar249;
  float fVar257;
  float fVar258;
  vfloat4 a0;
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  float fVar259;
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  float fVar260;
  float fVar270;
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [32];
  undefined1 auVar269 [32];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar275 [32];
  undefined1 auVar276 [32];
  undefined1 auVar274 [16];
  undefined1 auVar277 [64];
  undefined1 auVar278 [64];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar284 [32];
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_4b8 [16];
  int local_48c;
  undefined1 local_488 [16];
  undefined1 local_478 [16];
  undefined1 local_468 [16];
  float local_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  float fStack_440;
  undefined4 uStack_43c;
  undefined1 local_438 [32];
  undefined1 local_418 [16];
  ulong local_400;
  undefined1 local_3f8 [8];
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined8 uStack_3e0;
  float local_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  undefined1 local_3c8 [8];
  float fStack_3c0;
  float fStack_3bc;
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  undefined1 local_3a8 [8];
  float fStack_3a0;
  float fStack_39c;
  undefined1 local_398 [8];
  float fStack_390;
  float fStack_38c;
  undefined1 local_388 [16];
  undefined1 local_378 [16];
  undefined1 local_368 [16];
  undefined1 local_358 [8];
  float fStack_350;
  float fStack_34c;
  undefined1 local_348 [16];
  undefined1 local_338 [16];
  RTCFilterFunctionNArguments local_328;
  uint auStack_2f8 [4];
  undefined8 local_2e8;
  float local_2e0;
  undefined8 local_2dc;
  uint local_2d4;
  uint local_2d0;
  uint local_2cc;
  uint local_2c8;
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [8];
  float fStack_2a0;
  float fStack_29c;
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  undefined1 local_258 [8];
  float fStack_250;
  float fStack_24c;
  undefined1 local_248 [16];
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  undefined1 local_218 [32];
  undefined1 local_1f8 [32];
  uint uStack_1d8;
  float afStack_1d4 [7];
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  undefined1 local_178 [32];
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  undefined1 local_138 [32];
  undefined1 local_118 [32];
  undefined1 local_f8 [32];
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  ulong uVar58;
  undefined1 auVar123 [32];
  
  PVar4 = prim[1];
  uVar60 = (ulong)(byte)PVar4;
  fVar145 = *(float *)(prim + uVar60 * 0x19 + 0x12);
  auVar13 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                       *(undefined1 (*) [16])(prim + uVar60 * 0x19 + 6));
  auVar66._0_4_ = fVar145 * auVar13._0_4_;
  auVar66._4_4_ = fVar145 * auVar13._4_4_;
  auVar66._8_4_ = fVar145 * auVar13._8_4_;
  auVar66._12_4_ = fVar145 * auVar13._12_4_;
  auVar147._0_4_ = fVar145 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar147._4_4_ = fVar145 * (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar147._8_4_ = fVar145 * (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar147._12_4_ = fVar145 * (ray->super_RayK<1>).dir.field_0.m128[3];
  auVar13 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 4 + 6)));
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar9 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 5 + 6)));
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar273 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 6 + 6)));
  auVar273 = vcvtdq2ps_avx(auVar273);
  auVar10 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 0xb + 6)));
  auVar10 = vcvtdq2ps_avx(auVar10);
  auVar11 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar4 * 0xc) + 6)));
  auVar11 = vcvtdq2ps_avx(auVar11);
  auVar12 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar4 * 0xc + uVar60 + 6)));
  auVar12 = vcvtdq2ps_avx(auVar12);
  uVar57 = (ulong)(uint)((int)(uVar60 * 9) * 2);
  auVar69 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar57 + 6)));
  auVar69 = vcvtdq2ps_avx(auVar69);
  auVar68 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar57 + uVar60 + 6)));
  auVar68 = vcvtdq2ps_avx(auVar68);
  uVar57 = (ulong)(uint)((int)(uVar60 * 5) << 2);
  auVar98 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar57 + 6)));
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar271._4_4_ = auVar147._0_4_;
  auVar271._0_4_ = auVar147._0_4_;
  auVar271._8_4_ = auVar147._0_4_;
  auVar271._12_4_ = auVar147._0_4_;
  auVar84 = vshufps_avx(auVar147,auVar147,0x55);
  auVar67 = vshufps_avx(auVar147,auVar147,0xaa);
  fVar145 = auVar67._0_4_;
  auVar239._0_4_ = fVar145 * auVar273._0_4_;
  fVar164 = auVar67._4_4_;
  auVar239._4_4_ = fVar164 * auVar273._4_4_;
  fVar166 = auVar67._8_4_;
  auVar239._8_4_ = fVar166 * auVar273._8_4_;
  fVar168 = auVar67._12_4_;
  auVar239._12_4_ = fVar168 * auVar273._12_4_;
  auVar228._0_4_ = auVar12._0_4_ * fVar145;
  auVar228._4_4_ = auVar12._4_4_ * fVar164;
  auVar228._8_4_ = auVar12._8_4_ * fVar166;
  auVar228._12_4_ = auVar12._12_4_ * fVar168;
  auVar202._0_4_ = auVar98._0_4_ * fVar145;
  auVar202._4_4_ = auVar98._4_4_ * fVar164;
  auVar202._8_4_ = auVar98._8_4_ * fVar166;
  auVar202._12_4_ = auVar98._12_4_ * fVar168;
  auVar67 = vfmadd231ps_fma(auVar239,auVar84,auVar9);
  auVar210 = vfmadd231ps_fma(auVar228,auVar84,auVar11);
  auVar84 = vfmadd231ps_fma(auVar202,auVar68,auVar84);
  auVar114 = vfmadd231ps_fma(auVar67,auVar271,auVar13);
  auVar210 = vfmadd231ps_fma(auVar210,auVar271,auVar10);
  auVar130 = vfmadd231ps_fma(auVar84,auVar69,auVar271);
  auVar272._4_4_ = auVar66._0_4_;
  auVar272._0_4_ = auVar66._0_4_;
  auVar272._8_4_ = auVar66._0_4_;
  auVar272._12_4_ = auVar66._0_4_;
  auVar84 = vshufps_avx(auVar66,auVar66,0x55);
  auVar67 = vshufps_avx(auVar66,auVar66,0xaa);
  fVar145 = auVar67._0_4_;
  auVar148._0_4_ = fVar145 * auVar273._0_4_;
  fVar164 = auVar67._4_4_;
  auVar148._4_4_ = fVar164 * auVar273._4_4_;
  fVar166 = auVar67._8_4_;
  auVar148._8_4_ = fVar166 * auVar273._8_4_;
  fVar168 = auVar67._12_4_;
  auVar148._12_4_ = fVar168 * auVar273._12_4_;
  auVar135._0_4_ = auVar12._0_4_ * fVar145;
  auVar135._4_4_ = auVar12._4_4_ * fVar164;
  auVar135._8_4_ = auVar12._8_4_ * fVar166;
  auVar135._12_4_ = auVar12._12_4_ * fVar168;
  auVar67._0_4_ = auVar98._0_4_ * fVar145;
  auVar67._4_4_ = auVar98._4_4_ * fVar164;
  auVar67._8_4_ = auVar98._8_4_ * fVar166;
  auVar67._12_4_ = auVar98._12_4_ * fVar168;
  auVar9 = vfmadd231ps_fma(auVar148,auVar84,auVar9);
  auVar273 = vfmadd231ps_fma(auVar135,auVar84,auVar11);
  auVar11 = vfmadd231ps_fma(auVar67,auVar84,auVar68);
  auVar12 = vfmadd231ps_fma(auVar9,auVar272,auVar13);
  auVar68 = vfmadd231ps_fma(auVar273,auVar272,auVar10);
  auVar98 = vfmadd231ps_fma(auVar11,auVar272,auVar69);
  local_338._8_4_ = 0x7fffffff;
  local_338._0_8_ = 0x7fffffff7fffffff;
  local_338._12_4_ = 0x7fffffff;
  auVar13 = vandps_avx(auVar114,local_338);
  auVar129._8_4_ = 0x219392ef;
  auVar129._0_8_ = 0x219392ef219392ef;
  auVar129._12_4_ = 0x219392ef;
  auVar13 = vcmpps_avx(auVar13,auVar129,1);
  auVar9 = vblendvps_avx(auVar114,auVar129,auVar13);
  auVar13 = vandps_avx(auVar210,local_338);
  auVar13 = vcmpps_avx(auVar13,auVar129,1);
  auVar273 = vblendvps_avx(auVar210,auVar129,auVar13);
  auVar13 = vandps_avx(auVar130,local_338);
  auVar13 = vcmpps_avx(auVar13,auVar129,1);
  auVar13 = vblendvps_avx(auVar130,auVar129,auVar13);
  auVar10 = vrcpps_avx(auVar9);
  auVar187._8_4_ = 0x3f800000;
  auVar187._0_8_ = &DAT_3f8000003f800000;
  auVar187._12_4_ = 0x3f800000;
  auVar9 = vfnmadd213ps_fma(auVar9,auVar10,auVar187);
  auVar10 = vfmadd132ps_fma(auVar9,auVar10,auVar10);
  auVar9 = vrcpps_avx(auVar273);
  auVar273 = vfnmadd213ps_fma(auVar273,auVar9,auVar187);
  auVar11 = vfmadd132ps_fma(auVar273,auVar9,auVar9);
  auVar9 = vrcpps_avx(auVar13);
  auVar13 = vfnmadd213ps_fma(auVar13,auVar9,auVar187);
  auVar69 = vfmadd132ps_fma(auVar13,auVar9,auVar9);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar60 * 7 + 6);
  auVar13 = vpmovsxwd_avx(auVar13);
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar13 = vsubps_avx(auVar13,auVar12);
  auVar130._0_4_ = auVar10._0_4_ * auVar13._0_4_;
  auVar130._4_4_ = auVar10._4_4_ * auVar13._4_4_;
  auVar130._8_4_ = auVar10._8_4_ * auVar13._8_4_;
  auVar130._12_4_ = auVar10._12_4_ * auVar13._12_4_;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar60 * 9 + 6);
  auVar13 = vpmovsxwd_avx(auVar9);
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar13 = vsubps_avx(auVar13,auVar12);
  auVar149._0_4_ = auVar10._0_4_ * auVar13._0_4_;
  auVar149._4_4_ = auVar10._4_4_ * auVar13._4_4_;
  auVar149._8_4_ = auVar10._8_4_ * auVar13._8_4_;
  auVar149._12_4_ = auVar10._12_4_ * auVar13._12_4_;
  auVar210._1_3_ = 0;
  auVar210[0] = PVar4;
  auVar273._8_8_ = 0;
  auVar273._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar4 * 0x10 + 6);
  auVar9 = vpmovsxwd_avx(auVar273);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar4 * 0x10 + uVar60 * -2 + 6);
  auVar13 = vpmovsxwd_avx(auVar10);
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar13 = vsubps_avx(auVar13,auVar68);
  auVar203._0_4_ = auVar13._0_4_ * auVar11._0_4_;
  auVar203._4_4_ = auVar13._4_4_ * auVar11._4_4_;
  auVar203._8_4_ = auVar13._8_4_ * auVar11._8_4_;
  auVar203._12_4_ = auVar13._12_4_ * auVar11._12_4_;
  auVar13 = vcvtdq2ps_avx(auVar9);
  auVar13 = vsubps_avx(auVar13,auVar68);
  auVar84._0_4_ = auVar11._0_4_ * auVar13._0_4_;
  auVar84._4_4_ = auVar11._4_4_ * auVar13._4_4_;
  auVar84._8_4_ = auVar11._8_4_ * auVar13._8_4_;
  auVar84._12_4_ = auVar11._12_4_ * auVar13._12_4_;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar57 + uVar60 + 6);
  auVar13 = vpmovsxwd_avx(auVar11);
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar13 = vsubps_avx(auVar13,auVar98);
  auVar114._0_4_ = auVar69._0_4_ * auVar13._0_4_;
  auVar114._4_4_ = auVar69._4_4_ * auVar13._4_4_;
  auVar114._8_4_ = auVar69._8_4_ * auVar13._8_4_;
  auVar114._12_4_ = auVar69._12_4_ * auVar13._12_4_;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar60 * 0x17 + 6);
  auVar13 = vpmovsxwd_avx(auVar12);
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar13 = vsubps_avx(auVar13,auVar98);
  auVar68._0_4_ = auVar69._0_4_ * auVar13._0_4_;
  auVar68._4_4_ = auVar69._4_4_ * auVar13._4_4_;
  auVar68._8_4_ = auVar69._8_4_ * auVar13._8_4_;
  auVar68._12_4_ = auVar69._12_4_ * auVar13._12_4_;
  auVar13 = vpminsd_avx(auVar130,auVar149);
  auVar9 = vpminsd_avx(auVar203,auVar84);
  auVar13 = vmaxps_avx(auVar13,auVar9);
  auVar9 = vpminsd_avx(auVar114,auVar68);
  uVar64 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar219._4_4_ = uVar64;
  auVar219._0_4_ = uVar64;
  auVar219._8_4_ = uVar64;
  auVar219._12_4_ = uVar64;
  auVar9 = vmaxps_avx(auVar9,auVar219);
  auVar13 = vmaxps_avx(auVar13,auVar9);
  local_2b8._0_4_ = auVar13._0_4_ * 0.99999964;
  local_2b8._4_4_ = auVar13._4_4_ * 0.99999964;
  local_2b8._8_4_ = auVar13._8_4_ * 0.99999964;
  local_2b8._12_4_ = auVar13._12_4_ * 0.99999964;
  auVar13 = vpmaxsd_avx(auVar130,auVar149);
  auVar9 = vpmaxsd_avx(auVar203,auVar84);
  auVar13 = vminps_avx(auVar13,auVar9);
  auVar9 = vpmaxsd_avx(auVar114,auVar68);
  fVar145 = (ray->super_RayK<1>).tfar;
  auVar98._4_4_ = fVar145;
  auVar98._0_4_ = fVar145;
  auVar98._8_4_ = fVar145;
  auVar98._12_4_ = fVar145;
  auVar9 = vminps_avx(auVar9,auVar98);
  auVar13 = vminps_avx(auVar13,auVar9);
  auVar69._0_4_ = auVar13._0_4_ * 1.0000004;
  auVar69._4_4_ = auVar13._4_4_ * 1.0000004;
  auVar69._8_4_ = auVar13._8_4_ * 1.0000004;
  auVar69._12_4_ = auVar13._12_4_ * 1.0000004;
  auVar210[4] = PVar4;
  auVar210._5_3_ = 0;
  auVar210[8] = PVar4;
  auVar210._9_3_ = 0;
  auVar210[0xc] = PVar4;
  auVar210._13_3_ = 0;
  auVar9 = vpcmpgtd_avx(auVar210,_DAT_01ff0cf0);
  auVar13 = vcmpps_avx(local_2b8,auVar69,2);
  auVar13 = vandps_avx(auVar13,auVar9);
  uVar54 = vmovmskps_avx(auVar13);
  if (uVar54 == 0) {
    return;
  }
  uVar54 = uVar54 & 0xff;
  auVar82._16_16_ = mm_lookupmask_ps._240_16_;
  auVar82._0_16_ = mm_lookupmask_ps._240_16_;
  local_1f8 = vblendps_avx(auVar82,ZEXT832(0) << 0x20,0x80);
LAB_016d151e:
  lVar59 = 0;
  uVar60 = (ulong)uVar54;
  for (uVar57 = uVar60; (uVar57 & 1) == 0; uVar57 = uVar57 >> 1 | 0x8000000000000000) {
    lVar59 = lVar59 + 1;
  }
  uVar54 = *(uint *)(prim + 2);
  pGVar5 = (context->scene->geometries).items[uVar54].ptr;
  local_400 = (ulong)*(uint *)(prim + lVar59 * 4 + 6);
  uVar57 = (ulong)*(uint *)(*(long *)&pGVar5->field_0x58 +
                           pGVar5[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)*(uint *)(prim + lVar59 * 4 + 6));
  p_Var6 = pGVar5[1].intersectionFilterN;
  pvVar7 = pGVar5[2].userPtr;
  _Var8 = pGVar5[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar13 = *(undefined1 (*) [16])(_Var8 + uVar57 * (long)pvVar7);
  auVar9 = *(undefined1 (*) [16])(_Var8 + (uVar57 + 1) * (long)pvVar7);
  auVar273 = *(undefined1 (*) [16])(_Var8 + (uVar57 + 2) * (long)pvVar7);
  pfVar1 = (float *)(_Var8 + (long)pvVar7 * (uVar57 + 3));
  fVar145 = *pfVar1;
  fVar164 = pfVar1[1];
  fVar166 = pfVar1[2];
  fVar168 = pfVar1[3];
  lVar59 = *(long *)&pGVar5[1].time_range.upper;
  auVar10 = *(undefined1 (*) [16])(lVar59 + (long)p_Var6 * uVar57);
  auVar11 = *(undefined1 (*) [16])(lVar59 + (long)p_Var6 * (uVar57 + 1));
  auVar12 = *(undefined1 (*) [16])(lVar59 + (long)p_Var6 * (uVar57 + 2));
  uVar60 = uVar60 - 1 & uVar60;
  pfVar1 = (float *)(lVar59 + (long)p_Var6 * (uVar57 + 3));
  fVar83 = *pfVar1;
  fVar65 = pfVar1[1];
  fVar146 = pfVar1[2];
  fVar184 = pfVar1[3];
  if (uVar60 != 0) {
    uVar63 = uVar60 - 1 & uVar60;
    for (uVar57 = uVar60; (uVar57 & 1) == 0; uVar57 = uVar57 >> 1 | 0x8000000000000000) {
    }
    if (uVar63 != 0) {
      for (; (uVar63 & 1) == 0; uVar63 = uVar63 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar85._8_4_ = 0x80000000;
  auVar85._0_8_ = 0x8000000080000000;
  auVar85._12_4_ = 0x80000000;
  auVar99._0_4_ = fVar83 * -0.0;
  auVar99._4_4_ = fVar65 * -0.0;
  auVar99._8_4_ = fVar146 * -0.0;
  auVar99._12_4_ = fVar184 * -0.0;
  auVar69 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar12,auVar99);
  auVar70._0_4_ = auVar11._0_4_ + auVar69._0_4_;
  auVar70._4_4_ = auVar11._4_4_ + auVar69._4_4_;
  auVar70._8_4_ = auVar11._8_4_ + auVar69._8_4_;
  auVar70._12_4_ = auVar11._12_4_ + auVar69._12_4_;
  auVar68 = vfmadd231ps_fma(auVar70,auVar10,auVar85);
  auVar114 = ZEXT816(0) << 0x40;
  auVar86._0_4_ = fVar83 * 0.0;
  auVar86._4_4_ = fVar65 * 0.0;
  auVar86._8_4_ = fVar146 * 0.0;
  auVar86._12_4_ = fVar184 * 0.0;
  auVar279._8_4_ = 0x3f000000;
  auVar279._0_8_ = 0x3f0000003f000000;
  auVar279._12_4_ = 0x3f000000;
  auVar69 = vfmadd231ps_fma(auVar86,auVar12,auVar279);
  auVar69 = vfmadd231ps_fma(auVar69,auVar11,auVar114);
  auVar67 = vfnmadd231ps_fma(auVar69,auVar10,auVar279);
  auVar261._0_4_ = fVar145 * -0.0;
  auVar261._4_4_ = fVar164 * -0.0;
  auVar261._8_4_ = fVar166 * -0.0;
  auVar261._12_4_ = fVar168 * -0.0;
  auVar69 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar273,auVar261);
  auVar250._0_4_ = auVar69._0_4_ + auVar9._0_4_;
  auVar250._4_4_ = auVar69._4_4_ + auVar9._4_4_;
  auVar250._8_4_ = auVar69._8_4_ + auVar9._8_4_;
  auVar250._12_4_ = auVar69._12_4_ + auVar9._12_4_;
  auVar69 = vfmadd231ps_fma(auVar250,auVar13,auVar85);
  auVar240._0_4_ = fVar145 * 0.0;
  auVar240._4_4_ = fVar164 * 0.0;
  auVar240._8_4_ = fVar166 * 0.0;
  auVar240._12_4_ = fVar168 * 0.0;
  auVar98 = vfmadd231ps_fma(auVar240,auVar273,auVar279);
  auVar98 = vfmadd231ps_fma(auVar98,auVar9,auVar114);
  auVar210 = vfnmadd231ps_fma(auVar98,auVar13,auVar279);
  auVar100._0_4_ = auVar12._0_4_ + auVar99._0_4_;
  auVar100._4_4_ = auVar12._4_4_ + auVar99._4_4_;
  auVar100._8_4_ = auVar12._8_4_ + auVar99._8_4_;
  auVar100._12_4_ = auVar12._12_4_ + auVar99._12_4_;
  auVar98 = vfmadd231ps_fma(auVar100,auVar11,auVar114);
  auVar98 = vfmadd231ps_fma(auVar98,auVar10,auVar85);
  auVar115._0_4_ = fVar83 * 0.5;
  auVar115._4_4_ = fVar65 * 0.5;
  auVar115._8_4_ = fVar146 * 0.5;
  auVar115._12_4_ = fVar184 * 0.5;
  auVar12 = vfmadd231ps_fma(auVar115,auVar114,auVar12);
  auVar11 = vfnmadd231ps_fma(auVar12,auVar279,auVar11);
  auVar84 = vfmadd231ps_fma(auVar11,auVar114,auVar10);
  auVar204._0_4_ = auVar261._0_4_ + auVar273._0_4_;
  auVar204._4_4_ = auVar261._4_4_ + auVar273._4_4_;
  auVar204._8_4_ = auVar261._8_4_ + auVar273._8_4_;
  auVar204._12_4_ = auVar261._12_4_ + auVar273._12_4_;
  auVar10 = vfmadd231ps_fma(auVar204,auVar9,auVar114);
  auVar11 = vfmadd231ps_fma(auVar10,auVar13,auVar85);
  auVar220._0_4_ = fVar145 * 0.5;
  auVar220._4_4_ = fVar164 * 0.5;
  auVar220._8_4_ = fVar166 * 0.5;
  auVar220._12_4_ = fVar168 * 0.5;
  auVar273 = vfmadd231ps_fma(auVar220,auVar114,auVar273);
  auVar9 = vfnmadd231ps_fma(auVar273,auVar279,auVar9);
  auVar12 = vfmadd231ps_fma(auVar9,auVar114,auVar13);
  auVar13 = vshufps_avx(auVar67,auVar67,0xc9);
  auVar9 = vshufps_avx(auVar69,auVar69,0xc9);
  fVar83 = auVar67._0_4_;
  auVar150._0_4_ = fVar83 * auVar9._0_4_;
  fVar65 = auVar67._4_4_;
  auVar150._4_4_ = fVar65 * auVar9._4_4_;
  fVar146 = auVar67._8_4_;
  auVar150._8_4_ = fVar146 * auVar9._8_4_;
  fVar184 = auVar67._12_4_;
  auVar150._12_4_ = fVar184 * auVar9._12_4_;
  auVar9 = vfmsub231ps_fma(auVar150,auVar13,auVar69);
  auVar273 = vshufps_avx(auVar9,auVar9,0xc9);
  auVar9 = vshufps_avx(auVar210,auVar210,0xc9);
  auVar151._0_4_ = fVar83 * auVar9._0_4_;
  auVar151._4_4_ = fVar65 * auVar9._4_4_;
  auVar151._8_4_ = fVar146 * auVar9._8_4_;
  auVar151._12_4_ = fVar184 * auVar9._12_4_;
  auVar13 = vfmsub231ps_fma(auVar151,auVar13,auVar210);
  auVar10 = vshufps_avx(auVar13,auVar13,0xc9);
  auVar13 = vshufps_avx(auVar84,auVar84,0xc9);
  auVar9 = vshufps_avx(auVar11,auVar11,0xc9);
  fVar113 = auVar84._0_4_;
  auVar131._0_4_ = fVar113 * auVar9._0_4_;
  fVar126 = auVar84._4_4_;
  auVar131._4_4_ = fVar126 * auVar9._4_4_;
  fVar127 = auVar84._8_4_;
  auVar131._8_4_ = fVar127 * auVar9._8_4_;
  fVar128 = auVar84._12_4_;
  auVar131._12_4_ = fVar128 * auVar9._12_4_;
  auVar9 = vfmsub231ps_fma(auVar131,auVar13,auVar11);
  auVar11 = vshufps_avx(auVar9,auVar9,0xc9);
  auVar9 = vshufps_avx(auVar12,auVar12,0xc9);
  auVar170._0_4_ = fVar113 * auVar9._0_4_;
  auVar170._4_4_ = fVar126 * auVar9._4_4_;
  auVar170._8_4_ = fVar127 * auVar9._8_4_;
  auVar170._12_4_ = fVar128 * auVar9._12_4_;
  auVar9 = vfmsub231ps_fma(auVar170,auVar13,auVar12);
  auVar13 = vdpps_avx(auVar273,auVar273,0x7f);
  auVar12 = vshufps_avx(auVar9,auVar9,0xc9);
  fVar164 = auVar13._0_4_;
  auVar221._4_12_ = ZEXT812(0) << 0x20;
  auVar221._0_4_ = fVar164;
  auVar9 = vrsqrtss_avx(auVar221,auVar221);
  fVar145 = auVar9._0_4_;
  auVar9 = vdpps_avx(auVar273,auVar10,0x7f);
  fVar145 = fVar145 * 1.5 + fVar164 * -0.5 * fVar145 * fVar145 * fVar145;
  fVar144 = fVar145 * auVar273._0_4_;
  fVar163 = fVar145 * auVar273._4_4_;
  fVar165 = fVar145 * auVar273._8_4_;
  fVar167 = fVar145 * auVar273._12_4_;
  auVar229._0_4_ = auVar10._0_4_ * fVar164;
  auVar229._4_4_ = auVar10._4_4_ * fVar164;
  auVar229._8_4_ = auVar10._8_4_ * fVar164;
  auVar229._12_4_ = auVar10._12_4_ * fVar164;
  fVar164 = auVar9._0_4_;
  auVar188._0_4_ = fVar164 * auVar273._0_4_;
  auVar188._4_4_ = fVar164 * auVar273._4_4_;
  auVar188._8_4_ = fVar164 * auVar273._8_4_;
  auVar188._12_4_ = fVar164 * auVar273._12_4_;
  auVar273 = vsubps_avx(auVar229,auVar188);
  auVar9 = vrcpss_avx(auVar221,auVar221);
  auVar13 = vfnmadd213ss_fma(auVar13,auVar9,SUB6416(ZEXT464(0x40000000),0));
  fVar166 = auVar9._0_4_ * auVar13._0_4_;
  auVar13 = vdpps_avx(auVar11,auVar11,0x7f);
  fVar168 = auVar13._0_4_;
  auVar205._4_12_ = ZEXT812(0) << 0x20;
  auVar205._0_4_ = fVar168;
  auVar9 = vrsqrtss_avx(auVar205,auVar205);
  fVar164 = auVar9._0_4_;
  fVar164 = fVar164 * 1.5 + fVar168 * -0.5 * fVar164 * fVar164 * fVar164;
  fVar249 = fVar164 * auVar11._0_4_;
  fVar257 = fVar164 * auVar11._4_4_;
  fVar258 = fVar164 * auVar11._8_4_;
  fVar259 = fVar164 * auVar11._12_4_;
  auVar9 = vdpps_avx(auVar11,auVar12,0x7f);
  auVar171._0_4_ = fVar168 * auVar12._0_4_;
  auVar171._4_4_ = fVar168 * auVar12._4_4_;
  auVar171._8_4_ = fVar168 * auVar12._8_4_;
  auVar171._12_4_ = fVar168 * auVar12._12_4_;
  fVar168 = auVar9._0_4_;
  auVar132._0_4_ = fVar168 * auVar11._0_4_;
  auVar132._4_4_ = fVar168 * auVar11._4_4_;
  auVar132._8_4_ = fVar168 * auVar11._8_4_;
  auVar132._12_4_ = fVar168 * auVar11._12_4_;
  auVar10 = vsubps_avx(auVar171,auVar132);
  auVar9 = vrcpss_avx(auVar205,auVar205);
  auVar13 = vfnmadd213ss_fma(auVar13,auVar9,SUB6416(ZEXT464(0x40000000),0));
  fVar168 = auVar13._0_4_ * auVar9._0_4_;
  auVar13 = vshufps_avx(auVar68,auVar68,0xff);
  auVar206._0_4_ = auVar13._0_4_ * fVar144;
  auVar206._4_4_ = auVar13._4_4_ * fVar163;
  auVar206._8_4_ = auVar13._8_4_ * fVar165;
  auVar206._12_4_ = auVar13._12_4_ * fVar167;
  local_348 = vsubps_avx(auVar68,auVar206);
  auVar9 = vshufps_avx(auVar67,auVar67,0xff);
  auVar152._0_4_ = auVar9._0_4_ * fVar144 + auVar13._0_4_ * fVar145 * fVar166 * auVar273._0_4_;
  auVar152._4_4_ = auVar9._4_4_ * fVar163 + auVar13._4_4_ * fVar145 * fVar166 * auVar273._4_4_;
  auVar152._8_4_ = auVar9._8_4_ * fVar165 + auVar13._8_4_ * fVar145 * fVar166 * auVar273._8_4_;
  auVar152._12_4_ = auVar9._12_4_ * fVar167 + auVar13._12_4_ * fVar145 * fVar166 * auVar273._12_4_;
  auVar273 = vsubps_avx(auVar67,auVar152);
  local_358._0_4_ = auVar206._0_4_ + auVar68._0_4_;
  local_358._4_4_ = auVar206._4_4_ + auVar68._4_4_;
  fStack_350 = auVar206._8_4_ + auVar68._8_4_;
  fStack_34c = auVar206._12_4_ + auVar68._12_4_;
  auVar13 = vshufps_avx(auVar98,auVar98,0xff);
  auVar87._0_4_ = fVar249 * auVar13._0_4_;
  auVar87._4_4_ = fVar257 * auVar13._4_4_;
  auVar87._8_4_ = fVar258 * auVar13._8_4_;
  auVar87._12_4_ = fVar259 * auVar13._12_4_;
  local_368 = vsubps_avx(auVar98,auVar87);
  auVar9 = vshufps_avx(auVar84,auVar84,0xff);
  auVar71._0_4_ = fVar249 * auVar9._0_4_ + auVar13._0_4_ * fVar164 * auVar10._0_4_ * fVar168;
  auVar71._4_4_ = fVar257 * auVar9._4_4_ + auVar13._4_4_ * fVar164 * auVar10._4_4_ * fVar168;
  auVar71._8_4_ = fVar258 * auVar9._8_4_ + auVar13._8_4_ * fVar164 * auVar10._8_4_ * fVar168;
  auVar71._12_4_ = fVar259 * auVar9._12_4_ + auVar13._12_4_ * fVar164 * auVar10._12_4_ * fVar168;
  auVar13 = vsubps_avx(auVar84,auVar71);
  local_3d8 = auVar98._0_4_ + auVar87._0_4_;
  fStack_3d4 = auVar98._4_4_ + auVar87._4_4_;
  fStack_3d0 = auVar98._8_4_ + auVar87._8_4_;
  fStack_3cc = auVar98._12_4_ + auVar87._12_4_;
  local_378._0_4_ = local_348._0_4_ + auVar273._0_4_ * 0.33333334;
  local_378._4_4_ = local_348._4_4_ + auVar273._4_4_ * 0.33333334;
  local_378._8_4_ = local_348._8_4_ + auVar273._8_4_ * 0.33333334;
  local_378._12_4_ = local_348._12_4_ + auVar273._12_4_ * 0.33333334;
  auVar72._0_4_ = auVar13._0_4_ * 0.33333334;
  auVar72._4_4_ = auVar13._4_4_ * 0.33333334;
  auVar72._8_4_ = auVar13._8_4_ * 0.33333334;
  auVar72._12_4_ = auVar13._12_4_ * 0.33333334;
  local_388 = vsubps_avx(local_368,auVar72);
  aVar2 = (ray->super_RayK<1>).org.field_0;
  auVar273 = vsubps_avx(local_348,(undefined1  [16])aVar2);
  auVar13 = vshufps_avx(auVar273,auVar273,0x55);
  auVar9 = vshufps_avx(auVar273,auVar273,0xaa);
  aVar3 = (pre->ray_space).vy.field_0;
  fVar145 = (pre->ray_space).vz.field_0.m128[0];
  fVar164 = (pre->ray_space).vz.field_0.m128[1];
  fVar166 = (pre->ray_space).vz.field_0.m128[2];
  fVar168 = (pre->ray_space).vz.field_0.m128[3];
  auVar73._0_4_ = fVar145 * auVar9._0_4_;
  auVar73._4_4_ = fVar164 * auVar9._4_4_;
  auVar73._8_4_ = fVar166 * auVar9._8_4_;
  auVar73._12_4_ = fVar168 * auVar9._12_4_;
  auVar98 = vfmadd231ps_fma(auVar73,(undefined1  [16])aVar3,auVar13);
  auVar9 = vsubps_avx(local_378,(undefined1  [16])aVar2);
  local_458 = auVar9._0_4_;
  auVar13 = vshufps_avx(auVar9,auVar9,0x55);
  auVar9 = vshufps_avx(auVar9,auVar9,0xaa);
  auVar74._0_4_ = fVar145 * auVar9._0_4_;
  auVar74._4_4_ = fVar164 * auVar9._4_4_;
  auVar74._8_4_ = fVar166 * auVar9._8_4_;
  auVar74._12_4_ = fVar168 * auVar9._12_4_;
  auVar84 = vfmadd231ps_fma(auVar74,(undefined1  [16])aVar3,auVar13);
  auVar9 = vsubps_avx(local_388,(undefined1  [16])aVar2);
  auVar13 = vshufps_avx(auVar9,auVar9,0xaa);
  auVar75._0_4_ = fVar145 * auVar13._0_4_;
  auVar75._4_4_ = fVar164 * auVar13._4_4_;
  auVar75._8_4_ = fVar166 * auVar13._8_4_;
  auVar75._12_4_ = fVar168 * auVar13._12_4_;
  auVar13 = vshufps_avx(auVar9,auVar9,0x55);
  auVar67 = vfmadd231ps_fma(auVar75,(undefined1  [16])aVar3,auVar13);
  auVar10 = vsubps_avx(local_368,(undefined1  [16])aVar2);
  auVar13 = vshufps_avx(auVar10,auVar10,0xaa);
  auVar76._0_4_ = fVar145 * auVar13._0_4_;
  auVar76._4_4_ = fVar164 * auVar13._4_4_;
  auVar76._8_4_ = fVar166 * auVar13._8_4_;
  auVar76._12_4_ = fVar168 * auVar13._12_4_;
  auVar13 = vshufps_avx(auVar10,auVar10,0x55);
  auVar210 = vfmadd231ps_fma(auVar76,(undefined1  [16])aVar3,auVar13);
  auVar11 = vsubps_avx(_local_358,(undefined1  [16])aVar2);
  auVar13 = vshufps_avx(auVar11,auVar11,0xaa);
  auVar153._0_4_ = fVar145 * auVar13._0_4_;
  auVar153._4_4_ = fVar164 * auVar13._4_4_;
  auVar153._8_4_ = fVar166 * auVar13._8_4_;
  auVar153._12_4_ = fVar168 * auVar13._12_4_;
  auVar13 = vshufps_avx(auVar11,auVar11,0x55);
  auVar114 = vfmadd231ps_fma(auVar153,(undefined1  [16])aVar3,auVar13);
  local_398._0_4_ = (fVar83 + auVar152._0_4_) * 0.33333334 + (float)local_358._0_4_;
  local_398._4_4_ = (fVar65 + auVar152._4_4_) * 0.33333334 + (float)local_358._4_4_;
  fStack_390 = (fVar146 + auVar152._8_4_) * 0.33333334 + fStack_350;
  fStack_38c = (fVar184 + auVar152._12_4_) * 0.33333334 + fStack_34c;
  auVar12 = vsubps_avx(_local_398,(undefined1  [16])aVar2);
  auVar13 = vshufps_avx(auVar12,auVar12,0xaa);
  auVar241._0_4_ = fVar145 * auVar13._0_4_;
  auVar241._4_4_ = fVar164 * auVar13._4_4_;
  auVar241._8_4_ = fVar166 * auVar13._8_4_;
  auVar241._12_4_ = fVar168 * auVar13._12_4_;
  auVar13 = vshufps_avx(auVar12,auVar12,0x55);
  auVar130 = vfmadd231ps_fma(auVar241,(undefined1  [16])aVar3,auVar13);
  auVar230._0_4_ = (fVar113 + auVar71._0_4_) * 0.33333334;
  auVar230._4_4_ = (fVar126 + auVar71._4_4_) * 0.33333334;
  auVar230._8_4_ = (fVar127 + auVar71._8_4_) * 0.33333334;
  auVar230._12_4_ = (fVar128 + auVar71._12_4_) * 0.33333334;
  auVar48._4_4_ = fStack_3d4;
  auVar48._0_4_ = local_3d8;
  auVar48._8_4_ = fStack_3d0;
  auVar48._12_4_ = fStack_3cc;
  _local_3a8 = vsubps_avx(auVar48,auVar230);
  auVar69 = vsubps_avx(_local_3a8,(undefined1  [16])aVar2);
  auVar13 = vshufps_avx(auVar69,auVar69,0xaa);
  auVar231._0_4_ = fVar145 * auVar13._0_4_;
  auVar231._4_4_ = fVar164 * auVar13._4_4_;
  auVar231._8_4_ = fVar166 * auVar13._8_4_;
  auVar231._12_4_ = fVar168 * auVar13._12_4_;
  auVar13 = vshufps_avx(auVar69,auVar69,0x55);
  auVar66 = vfmadd231ps_fma(auVar231,(undefined1  [16])aVar3,auVar13);
  auVar68 = vsubps_avx(auVar48,(undefined1  [16])aVar2);
  auVar13 = vshufps_avx(auVar68,auVar68,0xaa);
  auVar189._0_4_ = fVar145 * auVar13._0_4_;
  auVar189._4_4_ = fVar164 * auVar13._4_4_;
  auVar189._8_4_ = fVar166 * auVar13._8_4_;
  auVar189._12_4_ = fVar168 * auVar13._12_4_;
  auVar13 = vshufps_avx(auVar68,auVar68,0x55);
  auVar13 = vfmadd231ps_fma(auVar189,(undefined1  [16])aVar3,auVar13);
  local_418._0_4_ = auVar273._0_4_;
  auVar172._4_4_ = local_418._0_4_;
  auVar172._0_4_ = local_418._0_4_;
  auVar172._8_4_ = local_418._0_4_;
  auVar172._12_4_ = local_418._0_4_;
  aVar3 = (pre->ray_space).vx.field_0;
  auVar98 = vfmadd231ps_fma(auVar98,(undefined1  [16])aVar3,auVar172);
  auVar173._4_4_ = local_458;
  auVar173._0_4_ = local_458;
  auVar173._8_4_ = local_458;
  auVar173._12_4_ = local_458;
  auVar84 = vfmadd231ps_fma(auVar84,(undefined1  [16])aVar3,auVar173);
  uVar64 = auVar9._0_4_;
  auVar174._4_4_ = uVar64;
  auVar174._0_4_ = uVar64;
  auVar174._8_4_ = uVar64;
  auVar174._12_4_ = uVar64;
  auVar67 = vfmadd231ps_fma(auVar67,(undefined1  [16])aVar3,auVar174);
  uVar64 = auVar10._0_4_;
  auVar175._4_4_ = uVar64;
  auVar175._0_4_ = uVar64;
  auVar175._8_4_ = uVar64;
  auVar175._12_4_ = uVar64;
  auVar10 = vfmadd231ps_fma(auVar210,(undefined1  [16])aVar3,auVar175);
  uVar64 = auVar11._0_4_;
  auVar176._4_4_ = uVar64;
  auVar176._0_4_ = uVar64;
  auVar176._8_4_ = uVar64;
  auVar176._12_4_ = uVar64;
  auVar11 = vfmadd231ps_fma(auVar114,(undefined1  [16])aVar3,auVar176);
  uVar64 = auVar12._0_4_;
  auVar177._4_4_ = uVar64;
  auVar177._0_4_ = uVar64;
  auVar177._8_4_ = uVar64;
  auVar177._12_4_ = uVar64;
  auVar12 = vfmadd231ps_fma(auVar130,(undefined1  [16])aVar3,auVar177);
  uVar64 = auVar69._0_4_;
  auVar77._4_4_ = uVar64;
  auVar77._0_4_ = uVar64;
  auVar77._8_4_ = uVar64;
  auVar77._12_4_ = uVar64;
  auVar69 = vfmadd231ps_fma(auVar66,(undefined1  [16])aVar3,auVar77);
  uVar64 = auVar68._0_4_;
  auVar78._4_4_ = uVar64;
  auVar78._0_4_ = uVar64;
  auVar78._8_4_ = uVar64;
  auVar78._12_4_ = uVar64;
  auVar68 = vfmadd231ps_fma(auVar13,(undefined1  [16])aVar3,auVar78);
  local_468 = vmovlhps_avx(auVar98,auVar11);
  local_478 = vmovlhps_avx(auVar84,auVar12);
  local_488 = vmovlhps_avx(auVar67,auVar69);
  _local_258 = vmovlhps_avx(auVar10,auVar68);
  auVar277 = ZEXT1664(_local_258);
  auVar13 = vminps_avx(local_468,local_478);
  auVar9 = vminps_avx(local_488,_local_258);
  auVar273 = vminps_avx(auVar13,auVar9);
  auVar13 = vmaxps_avx(local_468,local_478);
  auVar9 = vmaxps_avx(local_488,_local_258);
  auVar13 = vmaxps_avx(auVar13,auVar9);
  auVar9 = vshufpd_avx(auVar273,auVar273,3);
  auVar273 = vminps_avx(auVar273,auVar9);
  auVar9 = vshufpd_avx(auVar13,auVar13,3);
  auVar9 = vmaxps_avx(auVar13,auVar9);
  auVar13 = vandps_avx(local_338,auVar273);
  auVar9 = vandps_avx(local_338,auVar9);
  auVar13 = vmaxps_avx(auVar13,auVar9);
  auVar9 = vmovshdup_avx(auVar13);
  auVar13 = vmaxss_avx(auVar9,auVar13);
  local_198 = auVar13._0_4_ * 9.536743e-07;
  auVar280._8_8_ = auVar98._0_8_;
  auVar280._0_8_ = auVar98._0_8_;
  auVar207._8_8_ = auVar84._0_8_;
  auVar207._0_8_ = auVar84._0_8_;
  auVar88._8_8_ = auVar67._0_8_;
  auVar88._0_8_ = auVar67._0_8_;
  auVar101._8_8_ = auVar10._0_8_;
  auVar101._0_8_ = auVar10._0_8_;
  local_418 = ZEXT416((uint)local_198);
  fStack_194 = local_198;
  fStack_190 = local_198;
  fStack_18c = local_198;
  fStack_188 = local_198;
  fStack_184 = local_198;
  fStack_180 = local_198;
  fStack_17c = local_198;
  fStack_1b0 = -local_198;
  local_1b8 = -local_198;
  fStack_1b4 = -local_198;
  fStack_1ac = fStack_1b0;
  fStack_1a8 = fStack_1b0;
  fStack_1a4 = fStack_1b0;
  fStack_1a0 = fStack_1b0;
  fStack_19c = fStack_1b0;
  uVar57 = 0;
  local_228 = vsubps_avx(local_478,local_468);
  local_238 = vsubps_avx(local_488,local_478);
  local_248 = vsubps_avx(_local_258,local_488);
  local_278 = vsubps_avx(_local_358,local_348);
  local_288 = vsubps_avx(_local_398,local_378);
  local_298 = vsubps_avx(_local_3a8,local_388);
  auVar49._4_4_ = fStack_3d4;
  auVar49._0_4_ = local_3d8;
  auVar49._8_4_ = fStack_3d0;
  auVar49._12_4_ = fStack_3cc;
  _local_2a8 = vsubps_avx(auVar49,local_368);
  local_4b8 = ZEXT816(0x3f80000000000000);
  local_268 = local_4b8;
  do {
    auVar13 = vshufps_avx(local_4b8,local_4b8,0x50);
    auVar116._8_4_ = 0x3f800000;
    auVar116._0_8_ = &DAT_3f8000003f800000;
    auVar116._12_4_ = 0x3f800000;
    auVar123._16_4_ = 0x3f800000;
    auVar123._0_16_ = auVar116;
    auVar123._20_4_ = 0x3f800000;
    auVar123._24_4_ = 0x3f800000;
    auVar123._28_4_ = 0x3f800000;
    auVar9 = vsubps_avx(auVar116,auVar13);
    fVar145 = auVar13._0_4_;
    fVar127 = auVar11._0_4_;
    auVar79._0_4_ = fVar127 * fVar145;
    fVar164 = auVar13._4_4_;
    fVar128 = auVar11._4_4_;
    auVar79._4_4_ = fVar128 * fVar164;
    fVar166 = auVar13._8_4_;
    auVar79._8_4_ = fVar127 * fVar166;
    fVar168 = auVar13._12_4_;
    auVar79._12_4_ = fVar128 * fVar168;
    fVar260 = auVar12._0_4_;
    auVar154._0_4_ = fVar260 * fVar145;
    fVar270 = auVar12._4_4_;
    auVar154._4_4_ = fVar270 * fVar164;
    auVar154._8_4_ = fVar260 * fVar166;
    auVar154._12_4_ = fVar270 * fVar168;
    fVar227 = auVar69._0_4_;
    auVar190._0_4_ = fVar227 * fVar145;
    fVar238 = auVar69._4_4_;
    auVar190._4_4_ = fVar238 * fVar164;
    auVar190._8_4_ = fVar227 * fVar166;
    auVar190._12_4_ = fVar238 * fVar168;
    fVar113 = auVar68._0_4_;
    auVar232._0_4_ = fVar113 * fVar145;
    fVar126 = auVar68._4_4_;
    auVar232._4_4_ = fVar126 * fVar164;
    auVar232._8_4_ = fVar113 * fVar166;
    auVar232._12_4_ = fVar126 * fVar168;
    auVar98 = vfmadd231ps_fma(auVar79,auVar9,auVar280);
    auVar84 = vfmadd231ps_fma(auVar154,auVar9,auVar207);
    auVar67 = vfmadd231ps_fma(auVar190,auVar9,auVar88);
    auVar210 = vfmadd231ps_fma(auVar232,auVar101,auVar9);
    local_458 = auVar210._0_4_;
    auVar13 = vmovshdup_avx(local_268);
    fVar145 = local_268._0_4_;
    fVar83 = (auVar13._0_4_ - fVar145) * 0.04761905;
    auVar218._4_4_ = fVar145;
    auVar218._0_4_ = fVar145;
    auVar218._8_4_ = fVar145;
    auVar218._12_4_ = fVar145;
    auVar218._16_4_ = fVar145;
    auVar218._20_4_ = fVar145;
    auVar218._24_4_ = fVar145;
    auVar218._28_4_ = fVar145;
    auVar110._0_8_ = auVar13._0_8_;
    auVar110._8_8_ = auVar110._0_8_;
    auVar110._16_8_ = auVar110._0_8_;
    auVar110._24_8_ = auVar110._0_8_;
    auVar82 = vsubps_avx(auVar110,auVar218);
    uVar64 = auVar98._0_4_;
    auVar284._4_4_ = uVar64;
    auVar284._0_4_ = uVar64;
    auVar284._8_4_ = uVar64;
    auVar284._12_4_ = uVar64;
    auVar284._16_4_ = uVar64;
    auVar284._20_4_ = uVar64;
    auVar284._24_4_ = uVar64;
    auVar284._28_4_ = uVar64;
    auVar13 = vmovshdup_avx(auVar98);
    uVar169 = auVar13._0_8_;
    auVar268._8_8_ = uVar169;
    auVar268._0_8_ = uVar169;
    auVar268._16_8_ = uVar169;
    auVar268._24_8_ = uVar169;
    fVar65 = auVar84._0_4_;
    auVar96._4_4_ = fVar65;
    auVar96._0_4_ = fVar65;
    auVar96._8_4_ = fVar65;
    auVar96._12_4_ = fVar65;
    auVar96._16_4_ = fVar65;
    auVar96._20_4_ = fVar65;
    auVar96._24_4_ = fVar65;
    auVar96._28_4_ = fVar65;
    auVar9 = vmovshdup_avx(auVar84);
    auVar181._0_8_ = auVar9._0_8_;
    auVar181._8_8_ = auVar181._0_8_;
    auVar181._16_8_ = auVar181._0_8_;
    auVar181._24_8_ = auVar181._0_8_;
    fVar144 = auVar67._0_4_;
    auVar248._4_4_ = fVar144;
    auVar248._0_4_ = fVar144;
    auVar248._8_4_ = fVar144;
    auVar248._12_4_ = fVar144;
    auVar248._16_4_ = fVar144;
    auVar248._20_4_ = fVar144;
    auVar248._24_4_ = fVar144;
    auVar248._28_4_ = fVar144;
    auVar273 = vmovshdup_avx(auVar67);
    auVar226._0_8_ = auVar273._0_8_;
    auVar226._8_8_ = auVar226._0_8_;
    auVar226._16_8_ = auVar226._0_8_;
    auVar226._24_8_ = auVar226._0_8_;
    auVar10 = vmovshdup_avx(auVar210);
    auVar114 = vfmadd132ps_fma(auVar82,auVar218,_DAT_02020f20);
    auVar82 = vsubps_avx(auVar123,ZEXT1632(auVar114));
    fVar145 = auVar114._0_4_;
    auVar278._0_4_ = fVar65 * fVar145;
    fVar164 = auVar114._4_4_;
    auVar278._4_4_ = fVar65 * fVar164;
    fVar166 = auVar114._8_4_;
    auVar278._8_4_ = fVar65 * fVar166;
    fVar168 = auVar114._12_4_;
    auVar278._12_4_ = fVar65 * fVar168;
    auVar278._16_4_ = fVar65 * 0.0;
    auVar278._20_4_ = fVar65 * 0.0;
    auVar278._28_36_ = auVar277._28_36_;
    auVar278._24_4_ = fVar65 * 0.0;
    auVar114 = vfmadd231ps_fma(auVar278._0_32_,auVar82,auVar284);
    fVar146 = auVar9._0_4_;
    fVar184 = auVar9._4_4_;
    auVar14._4_4_ = fVar184 * fVar164;
    auVar14._0_4_ = fVar146 * fVar145;
    auVar14._8_4_ = fVar146 * fVar166;
    auVar14._12_4_ = fVar184 * fVar168;
    auVar14._16_4_ = fVar146 * 0.0;
    auVar14._20_4_ = fVar184 * 0.0;
    auVar14._24_4_ = fVar146 * 0.0;
    auVar14._28_4_ = local_458;
    auVar130 = vfmadd231ps_fma(auVar14,auVar82,auVar268);
    auVar15._4_4_ = fVar144 * fVar164;
    auVar15._0_4_ = fVar144 * fVar145;
    auVar15._8_4_ = fVar144 * fVar166;
    auVar15._12_4_ = fVar144 * fVar168;
    auVar15._16_4_ = fVar144 * 0.0;
    auVar15._20_4_ = fVar144 * 0.0;
    auVar15._24_4_ = fVar144 * 0.0;
    auVar15._28_4_ = auVar13._4_4_;
    auVar66 = vfmadd231ps_fma(auVar15,auVar82,auVar96);
    fVar146 = auVar273._0_4_;
    fVar184 = auVar273._4_4_;
    auVar16._4_4_ = fVar184 * fVar164;
    auVar16._0_4_ = fVar146 * fVar145;
    auVar16._8_4_ = fVar146 * fVar166;
    auVar16._12_4_ = fVar184 * fVar168;
    auVar16._16_4_ = fVar146 * 0.0;
    auVar16._20_4_ = fVar184 * 0.0;
    auVar16._24_4_ = fVar146 * 0.0;
    auVar16._28_4_ = uVar64;
    auVar135 = vfmadd231ps_fma(auVar16,auVar82,auVar181);
    auVar13 = vshufps_avx(auVar98,auVar98,0xaa);
    auVar182._0_8_ = auVar13._0_8_;
    auVar182._8_8_ = auVar182._0_8_;
    auVar182._16_8_ = auVar182._0_8_;
    auVar182._24_8_ = auVar182._0_8_;
    auVar9 = vshufps_avx(auVar98,auVar98,0xff);
    uStack_3f0 = auVar9._0_8_;
    local_3f8 = (undefined1  [8])uStack_3f0;
    uStack_3e8 = uStack_3f0;
    uStack_3e0 = uStack_3f0;
    auVar17._4_4_ = fVar164 * local_458;
    auVar17._0_4_ = fVar145 * local_458;
    auVar17._8_4_ = fVar166 * local_458;
    auVar17._12_4_ = fVar168 * local_458;
    auVar17._16_4_ = local_458 * 0.0;
    auVar17._20_4_ = local_458 * 0.0;
    auVar17._24_4_ = local_458 * 0.0;
    auVar17._28_4_ = 0x3f800000;
    auVar129 = vfmadd231ps_fma(auVar17,auVar82,auVar248);
    auVar273 = vshufps_avx(auVar84,auVar84,0xaa);
    auVar142._0_8_ = auVar273._0_8_;
    auVar142._8_8_ = auVar142._0_8_;
    auVar142._16_8_ = auVar142._0_8_;
    auVar142._24_8_ = auVar142._0_8_;
    auVar98 = vshufps_avx(auVar84,auVar84,0xff);
    auVar162._0_8_ = auVar98._0_8_;
    auVar162._8_8_ = auVar162._0_8_;
    auVar162._16_8_ = auVar162._0_8_;
    auVar162._24_8_ = auVar162._0_8_;
    fVar146 = auVar10._0_4_;
    fVar184 = auVar10._4_4_;
    auVar19._4_4_ = fVar184 * fVar164;
    auVar19._0_4_ = fVar146 * fVar145;
    auVar19._8_4_ = fVar146 * fVar166;
    auVar19._12_4_ = fVar184 * fVar168;
    auVar19._16_4_ = fVar146 * 0.0;
    auVar19._20_4_ = fVar184 * 0.0;
    auVar19._24_4_ = fVar146 * 0.0;
    auVar19._28_4_ = fVar144;
    auVar147 = vfmadd231ps_fma(auVar19,auVar82,auVar226);
    auVar256._28_4_ = fVar65;
    auVar256._0_28_ =
         ZEXT1628(CONCAT412(auVar66._12_4_ * fVar168,
                            CONCAT48(auVar66._8_4_ * fVar166,
                                     CONCAT44(auVar66._4_4_ * fVar164,auVar66._0_4_ * fVar145))));
    auVar114 = vfmadd231ps_fma(auVar256,auVar82,ZEXT1632(auVar114));
    auVar20._28_4_ = auVar9._4_4_;
    auVar20._0_28_ =
         ZEXT1628(CONCAT412(auVar135._12_4_ * fVar168,
                            CONCAT48(auVar135._8_4_ * fVar166,
                                     CONCAT44(auVar135._4_4_ * fVar164,auVar135._0_4_ * fVar145))));
    auVar130 = vfmadd231ps_fma(auVar20,auVar82,ZEXT1632(auVar130));
    auVar9 = vshufps_avx(auVar67,auVar67,0xaa);
    uVar169 = auVar9._0_8_;
    auVar255._8_8_ = uVar169;
    auVar255._0_8_ = uVar169;
    auVar255._16_8_ = uVar169;
    auVar255._24_8_ = uVar169;
    auVar10 = vshufps_avx(auVar67,auVar67,0xff);
    uVar169 = auVar10._0_8_;
    auVar275._8_8_ = uVar169;
    auVar275._0_8_ = uVar169;
    auVar275._16_8_ = uVar169;
    auVar275._24_8_ = uVar169;
    auVar66 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar168 * auVar129._12_4_,
                                                 CONCAT48(fVar166 * auVar129._8_4_,
                                                          CONCAT44(fVar164 * auVar129._4_4_,
                                                                   fVar145 * auVar129._0_4_)))),
                              auVar82,ZEXT1632(auVar66));
    auVar84 = vshufps_avx(auVar210,auVar210,0xaa);
    auVar67 = vshufps_avx(auVar210,auVar210,0xff);
    local_458 = auVar67._0_4_;
    fStack_454 = auVar67._4_4_;
    auVar21._28_4_ = fStack_454;
    auVar21._0_28_ =
         ZEXT1628(CONCAT412(auVar147._12_4_ * fVar168,
                            CONCAT48(auVar147._8_4_ * fVar166,
                                     CONCAT44(auVar147._4_4_ * fVar164,auVar147._0_4_ * fVar145))));
    auVar67 = vfmadd231ps_fma(auVar21,auVar82,ZEXT1632(auVar135));
    auVar210 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar168 * auVar66._12_4_,
                                                  CONCAT48(fVar166 * auVar66._8_4_,
                                                           CONCAT44(fVar164 * auVar66._4_4_,
                                                                    fVar145 * auVar66._0_4_)))),
                               auVar82,ZEXT1632(auVar114));
    auVar14 = vsubps_avx(ZEXT1632(auVar66),ZEXT1632(auVar114));
    auVar114 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar168 * auVar67._12_4_,
                                                  CONCAT48(fVar166 * auVar67._8_4_,
                                                           CONCAT44(fVar164 * auVar67._4_4_,
                                                                    fVar145 * auVar67._0_4_)))),
                               auVar82,ZEXT1632(auVar130));
    auVar15 = vsubps_avx(ZEXT1632(auVar67),ZEXT1632(auVar130));
    fVar144 = fVar83 * auVar14._0_4_ * 3.0;
    fVar163 = fVar83 * auVar14._4_4_ * 3.0;
    auVar22._4_4_ = fVar163;
    auVar22._0_4_ = fVar144;
    fStack_450 = fVar83 * auVar14._8_4_ * 3.0;
    auVar22._8_4_ = fStack_450;
    fStack_44c = fVar83 * auVar14._12_4_ * 3.0;
    auVar22._12_4_ = fStack_44c;
    fStack_448 = fVar83 * auVar14._16_4_ * 3.0;
    auVar22._16_4_ = fStack_448;
    fStack_444 = fVar83 * auVar14._20_4_ * 3.0;
    auVar22._20_4_ = fStack_444;
    fStack_440 = fVar83 * auVar14._24_4_ * 3.0;
    auVar22._24_4_ = fStack_440;
    auVar22._28_4_ = 0x40400000;
    local_3c8._0_4_ = fVar83 * auVar15._0_4_ * 3.0;
    local_3c8._4_4_ = fVar83 * auVar15._4_4_ * 3.0;
    fStack_3c0 = fVar83 * auVar15._8_4_ * 3.0;
    fStack_3bc = fVar83 * auVar15._12_4_ * 3.0;
    fStack_3b8 = fVar83 * auVar15._16_4_ * 3.0;
    fStack_3b4 = fVar83 * auVar15._20_4_ * 3.0;
    fStack_3b0 = fVar83 * auVar15._24_4_ * 3.0;
    fStack_3ac = auVar15._28_4_;
    fVar65 = auVar273._0_4_;
    fVar146 = auVar273._4_4_;
    auVar23._4_4_ = fVar146 * fVar164;
    auVar23._0_4_ = fVar65 * fVar145;
    auVar23._8_4_ = fVar65 * fVar166;
    auVar23._12_4_ = fVar146 * fVar168;
    auVar23._16_4_ = fVar65 * 0.0;
    auVar23._20_4_ = fVar146 * 0.0;
    auVar23._24_4_ = fVar65 * 0.0;
    auVar23._28_4_ = auVar14._28_4_;
    auVar273 = vfmadd231ps_fma(auVar23,auVar82,auVar182);
    fVar65 = auVar98._0_4_;
    fVar184 = auVar98._4_4_;
    auVar24._4_4_ = fVar184 * fVar164;
    auVar24._0_4_ = fVar65 * fVar145;
    auVar24._8_4_ = fVar65 * fVar166;
    auVar24._12_4_ = fVar184 * fVar168;
    auVar24._16_4_ = fVar65 * 0.0;
    auVar24._20_4_ = fVar184 * 0.0;
    auVar24._24_4_ = fVar65 * 0.0;
    auVar24._28_4_ = auVar13._4_4_;
    auVar13 = vfmadd231ps_fma(auVar24,auVar82,_local_3f8);
    fVar65 = auVar9._0_4_;
    fVar184 = auVar9._4_4_;
    auVar25._4_4_ = fVar184 * fVar164;
    auVar25._0_4_ = fVar65 * fVar145;
    auVar25._8_4_ = fVar65 * fVar166;
    auVar25._12_4_ = fVar184 * fVar168;
    auVar25._16_4_ = fVar65 * 0.0;
    auVar25._20_4_ = fVar184 * 0.0;
    auVar25._24_4_ = fVar65 * 0.0;
    auVar25._28_4_ = fVar83;
    auVar9 = vfmadd231ps_fma(auVar25,auVar82,auVar142);
    fVar65 = auVar10._0_4_;
    fVar165 = auVar10._4_4_;
    auVar26._4_4_ = fVar165 * fVar164;
    auVar26._0_4_ = fVar65 * fVar145;
    auVar26._8_4_ = fVar65 * fVar166;
    auVar26._12_4_ = fVar165 * fVar168;
    auVar26._16_4_ = fVar65 * 0.0;
    auVar26._20_4_ = fVar165 * 0.0;
    auVar26._24_4_ = fVar65 * 0.0;
    auVar26._28_4_ = fVar146;
    auVar10 = vfmadd231ps_fma(auVar26,auVar82,auVar162);
    local_218 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar210));
    fVar65 = auVar84._0_4_;
    fVar146 = auVar84._4_4_;
    auVar27._4_4_ = fVar146 * fVar164;
    auVar27._0_4_ = fVar65 * fVar145;
    auVar27._8_4_ = fVar65 * fVar166;
    auVar27._12_4_ = fVar146 * fVar168;
    auVar27._16_4_ = fVar65 * 0.0;
    auVar27._20_4_ = fVar146 * 0.0;
    auVar27._24_4_ = fVar65 * 0.0;
    auVar27._28_4_ = local_218._28_4_;
    auVar98 = vfmadd231ps_fma(auVar27,auVar82,auVar255);
    _local_3f8 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar114));
    auVar19 = _local_3f8;
    auVar28._4_4_ = fVar164 * fStack_454;
    auVar28._0_4_ = fVar145 * local_458;
    auVar28._8_4_ = fVar166 * local_458;
    auVar28._12_4_ = fVar168 * fStack_454;
    auVar28._16_4_ = local_458 * 0.0;
    auVar28._20_4_ = fStack_454 * 0.0;
    auVar28._24_4_ = local_458 * 0.0;
    auVar28._28_4_ = fVar184;
    auVar84 = vfmadd231ps_fma(auVar28,auVar82,auVar275);
    auVar29._28_4_ = fVar146;
    auVar29._0_28_ =
         ZEXT1628(CONCAT412(fVar168 * auVar9._12_4_,
                            CONCAT48(fVar166 * auVar9._8_4_,
                                     CONCAT44(fVar164 * auVar9._4_4_,fVar145 * auVar9._0_4_))));
    auVar273 = vfmadd231ps_fma(auVar29,auVar82,ZEXT1632(auVar273));
    auVar13 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar168 * auVar10._12_4_,
                                                 CONCAT48(fVar166 * auVar10._8_4_,
                                                          CONCAT44(fVar164 * auVar10._4_4_,
                                                                   fVar145 * auVar10._0_4_)))),
                              auVar82,ZEXT1632(auVar13));
    local_458 = auVar210._0_4_ + fVar144;
    fStack_454 = auVar210._4_4_ + fVar163;
    fStack_450 = auVar210._8_4_ + fStack_450;
    fStack_44c = auVar210._12_4_ + fStack_44c;
    fStack_448 = fStack_448 + 0.0;
    fStack_444 = fStack_444 + 0.0;
    fStack_440 = fStack_440 + 0.0;
    uStack_43c = 0x40400000;
    auVar30._28_4_ = 0x40400000;
    auVar30._0_28_ =
         ZEXT1628(CONCAT412(auVar84._12_4_ * fVar168,
                            CONCAT48(auVar84._8_4_ * fVar166,
                                     CONCAT44(auVar84._4_4_ * fVar164,auVar84._0_4_ * fVar145))));
    auVar9 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar168 * auVar98._12_4_,
                                                CONCAT48(fVar166 * auVar98._8_4_,
                                                         CONCAT44(fVar164 * auVar98._4_4_,
                                                                  fVar145 * auVar98._0_4_)))),
                             auVar82,ZEXT1632(auVar9));
    auVar10 = vfmadd231ps_fma(auVar30,auVar82,ZEXT1632(auVar10));
    auVar98 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar168 * auVar9._12_4_,
                                                 CONCAT48(fVar166 * auVar9._8_4_,
                                                          CONCAT44(fVar164 * auVar9._4_4_,
                                                                   fVar145 * auVar9._0_4_)))),
                              auVar82,ZEXT1632(auVar273));
    auVar84 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar168 * auVar10._12_4_,
                                                 CONCAT48(fVar166 * auVar10._8_4_,
                                                          CONCAT44(fVar164 * auVar10._4_4_,
                                                                   fVar145 * auVar10._0_4_)))),
                              ZEXT1632(auVar13),auVar82);
    auVar82 = vsubps_avx(ZEXT1632(auVar9),ZEXT1632(auVar273));
    auVar14 = vsubps_avx(ZEXT1632(auVar10),ZEXT1632(auVar13));
    fVar145 = fVar83 * auVar82._0_4_ * 3.0;
    fVar164 = fVar83 * auVar82._4_4_ * 3.0;
    auVar31._4_4_ = fVar164;
    auVar31._0_4_ = fVar145;
    fVar166 = fVar83 * auVar82._8_4_ * 3.0;
    auVar31._8_4_ = fVar166;
    fVar168 = fVar83 * auVar82._12_4_ * 3.0;
    auVar31._12_4_ = fVar168;
    fVar144 = fVar83 * auVar82._16_4_ * 3.0;
    auVar31._16_4_ = fVar144;
    fVar163 = fVar83 * auVar82._20_4_ * 3.0;
    auVar31._20_4_ = fVar163;
    fVar165 = fVar83 * auVar82._24_4_ * 3.0;
    auVar31._24_4_ = fVar165;
    auVar31._28_4_ = 0x40400000;
    auVar201._0_4_ = fVar83 * auVar14._0_4_ * 3.0;
    auVar201._4_4_ = fVar83 * auVar14._4_4_ * 3.0;
    auVar201._8_4_ = fVar83 * auVar14._8_4_ * 3.0;
    auVar201._12_4_ = fVar83 * auVar14._12_4_ * 3.0;
    auVar201._16_4_ = fVar83 * auVar14._16_4_ * 3.0;
    auVar201._20_4_ = fVar83 * auVar14._20_4_ * 3.0;
    auVar201._24_4_ = fVar83 * auVar14._24_4_ * 3.0;
    auVar201._28_4_ = 0;
    local_438 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar98));
    local_78 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar84));
    auVar82 = vsubps_avx(ZEXT1632(auVar98),ZEXT1632(auVar210));
    auVar14 = vsubps_avx(ZEXT1632(auVar84),ZEXT1632(auVar114));
    auVar16 = vsubps_avx(local_438,local_218);
    fVar167 = auVar82._0_4_ + auVar16._0_4_;
    fVar249 = auVar82._4_4_ + auVar16._4_4_;
    fVar257 = auVar82._8_4_ + auVar16._8_4_;
    fVar258 = auVar82._12_4_ + auVar16._12_4_;
    fVar259 = auVar82._16_4_ + auVar16._16_4_;
    fVar185 = auVar82._20_4_ + auVar16._20_4_;
    fVar186 = auVar82._24_4_ + auVar16._24_4_;
    auVar17 = vsubps_avx(local_78,_local_3f8);
    auVar269._0_4_ = auVar14._0_4_ + auVar17._0_4_;
    auVar269._4_4_ = auVar14._4_4_ + auVar17._4_4_;
    auVar269._8_4_ = auVar14._8_4_ + auVar17._8_4_;
    auVar269._12_4_ = auVar14._12_4_ + auVar17._12_4_;
    auVar269._16_4_ = auVar14._16_4_ + auVar17._16_4_;
    auVar269._20_4_ = auVar14._20_4_ + auVar17._20_4_;
    auVar269._24_4_ = auVar14._24_4_ + auVar17._24_4_;
    auVar269._28_4_ = auVar14._28_4_ + auVar17._28_4_;
    fVar83 = auVar114._0_4_;
    local_158 = fVar83 + (float)local_3c8._0_4_;
    fVar65 = auVar114._4_4_;
    fStack_154 = fVar65 + (float)local_3c8._4_4_;
    fVar146 = auVar114._8_4_;
    fStack_150 = fVar146 + fStack_3c0;
    fVar184 = auVar114._12_4_;
    fStack_14c = fVar184 + fStack_3bc;
    fStack_148 = fStack_3b8 + 0.0;
    fStack_144 = fStack_3b4 + 0.0;
    fStack_140 = fStack_3b0 + 0.0;
    fStack_13c = auVar15._28_4_ + 0.0;
    local_98 = ZEXT1632(auVar210);
    auVar14 = vsubps_avx(local_98,auVar22);
    local_d8 = vpermps_avx2(_DAT_0205d4a0,auVar14);
    local_b8 = ZEXT1632(auVar114);
    auVar14 = vsubps_avx(local_b8,_local_3c8);
    local_178 = vpermps_avx2(_DAT_0205d4a0,auVar14);
    local_f8._0_4_ = auVar98._0_4_ + fVar145;
    local_f8._4_4_ = auVar98._4_4_ + fVar164;
    local_f8._8_4_ = auVar98._8_4_ + fVar166;
    local_f8._12_4_ = auVar98._12_4_ + fVar168;
    local_f8._16_4_ = fVar144 + 0.0;
    local_f8._20_4_ = fVar163 + 0.0;
    local_f8._24_4_ = fVar165 + 0.0;
    local_f8._28_4_ = 0x40400000;
    auVar256 = ZEXT1632(auVar98);
    auVar14 = vsubps_avx(auVar256,auVar31);
    _local_3c8 = vpermps_avx2(_DAT_0205d4a0,auVar14);
    fVar145 = auVar84._0_4_;
    local_138._0_4_ = fVar145 + auVar201._0_4_;
    fVar164 = auVar84._4_4_;
    local_138._4_4_ = fVar164 + auVar201._4_4_;
    fVar166 = auVar84._8_4_;
    local_138._8_4_ = fVar166 + auVar201._8_4_;
    fVar168 = auVar84._12_4_;
    local_138._12_4_ = fVar168 + auVar201._12_4_;
    local_138._16_4_ = auVar201._16_4_ + 0.0;
    local_138._20_4_ = auVar201._20_4_ + 0.0;
    local_138._24_4_ = auVar201._24_4_ + 0.0;
    local_138._28_4_ = 0;
    auVar14 = vsubps_avx(ZEXT1632(auVar84),auVar201);
    local_118 = vpermps_avx2(_DAT_0205d4a0,auVar14);
    auVar32._4_4_ = fVar65 * fVar249;
    auVar32._0_4_ = fVar83 * fVar167;
    auVar32._8_4_ = fVar146 * fVar257;
    auVar32._12_4_ = fVar184 * fVar258;
    auVar32._16_4_ = fVar259 * 0.0;
    auVar32._20_4_ = fVar185 * 0.0;
    auVar32._24_4_ = fVar186 * 0.0;
    auVar32._28_4_ = auVar14._28_4_;
    auVar13 = vfnmadd231ps_fma(auVar32,local_98,auVar269);
    auVar33._4_4_ = fStack_154 * fVar249;
    auVar33._0_4_ = local_158 * fVar167;
    auVar33._8_4_ = fStack_150 * fVar257;
    auVar33._12_4_ = fStack_14c * fVar258;
    auVar33._16_4_ = fStack_148 * fVar259;
    auVar33._20_4_ = fStack_144 * fVar185;
    auVar33._24_4_ = fStack_140 * fVar186;
    auVar33._28_4_ = local_3c8._28_4_;
    auVar46._4_4_ = fStack_454;
    auVar46._0_4_ = local_458;
    auVar46._8_4_ = fStack_450;
    auVar46._12_4_ = fStack_44c;
    auVar46._16_4_ = fStack_448;
    auVar46._20_4_ = fStack_444;
    auVar46._24_4_ = fStack_440;
    auVar46._28_4_ = 0x40400000;
    auVar9 = vfnmadd231ps_fma(auVar33,auVar269,auVar46);
    auVar34._4_4_ = local_178._4_4_ * fVar249;
    auVar34._0_4_ = local_178._0_4_ * fVar167;
    auVar34._8_4_ = local_178._8_4_ * fVar257;
    auVar34._12_4_ = local_178._12_4_ * fVar258;
    auVar34._16_4_ = local_178._16_4_ * fVar259;
    auVar34._20_4_ = local_178._20_4_ * fVar185;
    auVar34._24_4_ = local_178._24_4_ * fVar186;
    auVar34._28_4_ = fStack_13c;
    auVar273 = vfnmadd231ps_fma(auVar34,local_d8,auVar269);
    auVar35._4_4_ = fVar249 * (float)local_3f8._4_4_;
    auVar35._0_4_ = fVar167 * (float)local_3f8._0_4_;
    auVar35._8_4_ = fVar257 * (float)uStack_3f0;
    auVar35._12_4_ = fVar258 * uStack_3f0._4_4_;
    auVar35._16_4_ = fVar259 * (float)uStack_3e8;
    auVar35._20_4_ = fVar185 * uStack_3e8._4_4_;
    auVar35._24_4_ = fVar186 * (float)uStack_3e0;
    auVar35._28_4_ = local_178._28_4_;
    auVar10 = vfnmadd231ps_fma(auVar35,local_218,auVar269);
    auVar53._4_4_ = fVar164 * fVar249;
    auVar53._0_4_ = fVar145 * fVar167;
    auVar53._8_4_ = fVar166 * fVar257;
    auVar53._12_4_ = fVar168 * fVar258;
    auVar53._16_4_ = fVar259 * 0.0;
    auVar53._20_4_ = fVar185 * 0.0;
    auVar53._24_4_ = fVar186 * 0.0;
    auVar53._28_4_ = DAT_0205d4a0._28_4_;
    auVar98 = vfnmadd231ps_fma(auVar53,auVar256,auVar269);
    auVar36._4_4_ = local_138._4_4_ * fVar249;
    auVar36._0_4_ = local_138._0_4_ * fVar167;
    auVar36._8_4_ = local_138._8_4_ * fVar257;
    auVar36._12_4_ = local_138._12_4_ * fVar258;
    auVar36._16_4_ = local_138._16_4_ * fVar259;
    auVar36._20_4_ = local_138._20_4_ * fVar185;
    auVar36._24_4_ = local_138._24_4_ * fVar186;
    auVar36._28_4_ = local_218._28_4_;
    auVar67 = vfnmadd231ps_fma(auVar36,local_f8,auVar269);
    auVar37._4_4_ = local_118._4_4_ * fVar249;
    auVar37._0_4_ = local_118._0_4_ * fVar167;
    auVar37._8_4_ = local_118._8_4_ * fVar257;
    auVar37._12_4_ = local_118._12_4_ * fVar258;
    auVar37._16_4_ = local_118._16_4_ * fVar259;
    auVar37._20_4_ = local_118._20_4_ * fVar185;
    auVar37._24_4_ = local_118._24_4_ * fVar186;
    auVar37._28_4_ = local_d8._28_4_;
    auVar210 = vfnmadd231ps_fma(auVar37,auVar269,_local_3c8);
    auVar38._4_4_ = local_78._4_4_ * fVar249;
    auVar38._0_4_ = local_78._0_4_ * fVar167;
    auVar38._8_4_ = local_78._8_4_ * fVar257;
    auVar38._12_4_ = local_78._12_4_ * fVar258;
    auVar38._16_4_ = local_78._16_4_ * fVar259;
    auVar38._20_4_ = local_78._20_4_ * fVar185;
    auVar38._24_4_ = local_78._24_4_ * fVar186;
    auVar38._28_4_ = auVar82._28_4_ + auVar16._28_4_;
    auVar114 = vfnmadd231ps_fma(auVar38,auVar269,local_438);
    auVar14 = vminps_avx(ZEXT1632(auVar13),ZEXT1632(auVar9));
    auVar82 = vmaxps_avx(ZEXT1632(auVar13),ZEXT1632(auVar9));
    auVar15 = vminps_avx(ZEXT1632(auVar273),ZEXT1632(auVar10));
    auVar15 = vminps_avx(auVar14,auVar15);
    auVar14 = vmaxps_avx(ZEXT1632(auVar273),ZEXT1632(auVar10));
    auVar82 = vmaxps_avx(auVar82,auVar14);
    auVar16 = vminps_avx(ZEXT1632(auVar98),ZEXT1632(auVar67));
    auVar14 = vmaxps_avx(ZEXT1632(auVar98),ZEXT1632(auVar67));
    auVar17 = vminps_avx(ZEXT1632(auVar210),ZEXT1632(auVar114));
    auVar16 = vminps_avx(auVar16,auVar17);
    auVar16 = vminps_avx(auVar15,auVar16);
    auVar15 = vmaxps_avx(ZEXT1632(auVar210),ZEXT1632(auVar114));
    auVar14 = vmaxps_avx(auVar14,auVar15);
    auVar14 = vmaxps_avx(auVar82,auVar14);
    auVar52._4_4_ = fStack_194;
    auVar52._0_4_ = local_198;
    auVar52._8_4_ = fStack_190;
    auVar52._12_4_ = fStack_18c;
    auVar52._16_4_ = fStack_188;
    auVar52._20_4_ = fStack_184;
    auVar52._24_4_ = fStack_180;
    auVar52._28_4_ = fStack_17c;
    auVar82 = vcmpps_avx(auVar16,auVar52,2);
    auVar51._4_4_ = fStack_1b4;
    auVar51._0_4_ = local_1b8;
    auVar51._8_4_ = fStack_1b0;
    auVar51._12_4_ = fStack_1ac;
    auVar51._16_4_ = fStack_1a8;
    auVar51._20_4_ = fStack_1a4;
    auVar51._24_4_ = fStack_1a0;
    auVar51._28_4_ = fStack_19c;
    auVar14 = vcmpps_avx(auVar14,auVar51,5);
    auVar82 = vandps_avx(auVar14,auVar82);
    auVar14 = local_1f8 & auVar82;
    uVar55 = 0;
    if ((((((((auVar14 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar14 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar14 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar14 >> 0x7f,0) != '\0') ||
          (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar14 >> 0xbf,0) != '\0') ||
        (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar14[0x1f] < '\0')
    {
      auVar14 = vsubps_avx(local_218,local_98);
      auVar15 = vsubps_avx(local_438,auVar256);
      fVar163 = auVar14._0_4_ + auVar15._0_4_;
      fVar165 = auVar14._4_4_ + auVar15._4_4_;
      fVar167 = auVar14._8_4_ + auVar15._8_4_;
      fVar249 = auVar14._12_4_ + auVar15._12_4_;
      fVar257 = auVar14._16_4_ + auVar15._16_4_;
      fVar258 = auVar14._20_4_ + auVar15._20_4_;
      fVar259 = auVar14._24_4_ + auVar15._24_4_;
      auVar16 = vsubps_avx(_local_3f8,local_b8);
      auVar17 = vsubps_avx(local_78,ZEXT1632(auVar84));
      auVar97._0_4_ = auVar16._0_4_ + auVar17._0_4_;
      auVar97._4_4_ = auVar16._4_4_ + auVar17._4_4_;
      auVar97._8_4_ = auVar16._8_4_ + auVar17._8_4_;
      auVar97._12_4_ = auVar16._12_4_ + auVar17._12_4_;
      auVar97._16_4_ = auVar16._16_4_ + auVar17._16_4_;
      auVar97._20_4_ = auVar16._20_4_ + auVar17._20_4_;
      auVar97._24_4_ = auVar16._24_4_ + auVar17._24_4_;
      fVar144 = auVar17._28_4_;
      auVar97._28_4_ = auVar16._28_4_ + fVar144;
      auVar276._0_4_ = fVar83 * fVar163;
      auVar276._4_4_ = fVar65 * fVar165;
      auVar276._8_4_ = fVar146 * fVar167;
      auVar276._12_4_ = fVar184 * fVar249;
      auVar276._16_4_ = fVar257 * 0.0;
      auVar276._20_4_ = fVar258 * 0.0;
      auVar276._24_4_ = fVar259 * 0.0;
      auVar276._28_4_ = 0;
      auVar98 = vfnmadd231ps_fma(auVar276,auVar97,local_98);
      auVar39._4_4_ = fVar165 * fStack_154;
      auVar39._0_4_ = fVar163 * local_158;
      auVar39._8_4_ = fVar167 * fStack_150;
      auVar39._12_4_ = fVar249 * fStack_14c;
      auVar39._16_4_ = fVar257 * fStack_148;
      auVar39._20_4_ = fVar258 * fStack_144;
      auVar39._24_4_ = fVar259 * fStack_140;
      auVar39._28_4_ = fVar144;
      auVar47._4_4_ = fStack_454;
      auVar47._0_4_ = local_458;
      auVar47._8_4_ = fStack_450;
      auVar47._12_4_ = fStack_44c;
      auVar47._16_4_ = fStack_448;
      auVar47._20_4_ = fStack_444;
      auVar47._24_4_ = fStack_440;
      auVar47._28_4_ = 0x40400000;
      auVar13 = vfnmadd213ps_fma(auVar47,auVar97,auVar39);
      auVar40._4_4_ = fVar165 * local_178._4_4_;
      auVar40._0_4_ = fVar163 * local_178._0_4_;
      auVar40._8_4_ = fVar167 * local_178._8_4_;
      auVar40._12_4_ = fVar249 * local_178._12_4_;
      auVar40._16_4_ = fVar257 * local_178._16_4_;
      auVar40._20_4_ = fVar258 * local_178._20_4_;
      auVar40._24_4_ = fVar259 * local_178._24_4_;
      auVar40._28_4_ = fVar144;
      auVar9 = vfnmadd213ps_fma(local_d8,auVar97,auVar40);
      auVar41._4_4_ = (float)local_3f8._4_4_ * fVar165;
      auVar41._0_4_ = (float)local_3f8._0_4_ * fVar163;
      auVar41._8_4_ = (float)uStack_3f0 * fVar167;
      auVar41._12_4_ = uStack_3f0._4_4_ * fVar249;
      auVar41._16_4_ = (float)uStack_3e8 * fVar257;
      auVar41._20_4_ = uStack_3e8._4_4_ * fVar258;
      auVar41._24_4_ = (float)uStack_3e0 * fVar259;
      auVar41._28_4_ = fVar144;
      auVar84 = vfnmadd231ps_fma(auVar41,auVar97,local_218);
      auVar111._0_4_ = fVar145 * fVar163;
      auVar111._4_4_ = fVar164 * fVar165;
      auVar111._8_4_ = fVar166 * fVar167;
      auVar111._12_4_ = fVar168 * fVar249;
      auVar111._16_4_ = fVar257 * 0.0;
      auVar111._20_4_ = fVar258 * 0.0;
      auVar111._24_4_ = fVar259 * 0.0;
      auVar111._28_4_ = 0;
      auVar67 = vfnmadd231ps_fma(auVar111,auVar97,auVar256);
      auVar42._4_4_ = fVar165 * local_138._4_4_;
      auVar42._0_4_ = fVar163 * local_138._0_4_;
      auVar42._8_4_ = fVar167 * local_138._8_4_;
      auVar42._12_4_ = fVar249 * local_138._12_4_;
      auVar42._16_4_ = fVar257 * local_138._16_4_;
      auVar42._20_4_ = fVar258 * local_138._20_4_;
      auVar42._24_4_ = fVar259 * local_138._24_4_;
      auVar42._28_4_ = local_3f8._28_4_;
      auVar273 = vfnmadd213ps_fma(local_f8,auVar97,auVar42);
      auVar43._4_4_ = fVar165 * local_118._4_4_;
      auVar43._0_4_ = fVar163 * local_118._0_4_;
      auVar43._8_4_ = fVar167 * local_118._8_4_;
      auVar43._12_4_ = fVar249 * local_118._12_4_;
      auVar43._16_4_ = fVar257 * local_118._16_4_;
      auVar43._20_4_ = fVar258 * local_118._20_4_;
      auVar43._24_4_ = fVar259 * local_118._24_4_;
      auVar43._28_4_ = local_3f8._28_4_;
      auVar10 = vfnmadd213ps_fma(_local_3c8,auVar97,auVar43);
      auVar44._4_4_ = local_78._4_4_ * fVar165;
      auVar44._0_4_ = local_78._0_4_ * fVar163;
      auVar44._8_4_ = local_78._8_4_ * fVar167;
      auVar44._12_4_ = local_78._12_4_ * fVar249;
      auVar44._16_4_ = local_78._16_4_ * fVar257;
      auVar44._20_4_ = local_78._20_4_ * fVar258;
      auVar44._24_4_ = local_78._24_4_ * fVar259;
      auVar44._28_4_ = auVar14._28_4_ + auVar15._28_4_;
      auVar210 = vfnmadd231ps_fma(auVar44,auVar97,local_438);
      auVar15 = vminps_avx(ZEXT1632(auVar98),ZEXT1632(auVar13));
      auVar14 = vmaxps_avx(ZEXT1632(auVar98),ZEXT1632(auVar13));
      auVar16 = vminps_avx(ZEXT1632(auVar9),ZEXT1632(auVar84));
      auVar16 = vminps_avx(auVar15,auVar16);
      auVar15 = vmaxps_avx(ZEXT1632(auVar9),ZEXT1632(auVar84));
      auVar14 = vmaxps_avx(auVar14,auVar15);
      auVar17 = vminps_avx(ZEXT1632(auVar67),ZEXT1632(auVar273));
      auVar15 = vmaxps_avx(ZEXT1632(auVar67),ZEXT1632(auVar273));
      auVar256 = vminps_avx(ZEXT1632(auVar10),ZEXT1632(auVar210));
      auVar17 = vminps_avx(auVar17,auVar256);
      auVar17 = vminps_avx(auVar16,auVar17);
      auVar16 = vmaxps_avx(ZEXT1632(auVar10),ZEXT1632(auVar210));
      auVar15 = vmaxps_avx(auVar15,auVar16);
      auVar15 = vmaxps_avx(auVar14,auVar15);
      auVar14 = vcmpps_avx(auVar17,auVar52,2);
      auVar15 = vcmpps_avx(auVar15,auVar51,5);
      auVar14 = vandps_avx(auVar15,auVar14);
      auVar82 = vandps_avx(auVar82,local_1f8);
      auVar15 = auVar82 & auVar14;
      if ((((((((auVar15 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar15 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar15 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar15 >> 0x7f,0) != '\0') ||
            (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar15 >> 0xbf,0) != '\0') ||
          (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar15[0x1f] < '\0') {
        auVar82 = vandps_avx(auVar14,auVar82);
        uVar55 = vmovmskps_avx(auVar82);
      }
    }
    _local_3f8 = auVar19;
    if (uVar55 != 0) {
      auStack_2f8[uVar57] = uVar55;
      uVar169 = vmovlps_avx(local_268);
      *(undefined8 *)(&uStack_1d8 + uVar57 * 2) = uVar169;
      uVar63 = vmovlps_avx(local_4b8);
      auStack_58[uVar57] = uVar63;
      uVar57 = (ulong)((int)uVar57 + 1);
    }
    do {
      if ((int)uVar57 == 0) {
        fVar145 = (ray->super_RayK<1>).tfar;
        auVar81._4_4_ = fVar145;
        auVar81._0_4_ = fVar145;
        auVar81._8_4_ = fVar145;
        auVar81._12_4_ = fVar145;
        auVar13 = vcmpps_avx(local_2b8,auVar81,2);
        uVar54 = vmovmskps_avx(auVar13);
        uVar54 = (uint)uVar60 & uVar54;
        if (uVar54 == 0) {
          return;
        }
        goto LAB_016d151e;
      }
      uVar56 = (int)uVar57 - 1;
      uVar58 = (ulong)uVar56;
      uVar62 = auStack_2f8[uVar58];
      uVar55 = (&uStack_1d8)[uVar58 * 2];
      fVar145 = afStack_1d4[uVar58 * 2];
      iVar18 = 0;
      for (uVar63 = (ulong)uVar62; (uVar63 & 1) == 0; uVar63 = uVar63 >> 1 | 0x8000000000000000) {
        iVar18 = iVar18 + 1;
      }
      uVar62 = uVar62 - 1 & uVar62;
      if (uVar62 == 0) {
        uVar57 = (ulong)uVar56;
      }
      local_4b8._8_8_ = 0;
      local_4b8._0_8_ = auStack_58[uVar58];
      auStack_2f8[uVar58] = uVar62;
      fVar164 = (float)(iVar18 + 1) * 0.14285715;
      auVar13 = vfmadd231ss_fma(ZEXT416((uint)(fVar145 * (float)iVar18 * 0.14285715)),
                                ZEXT416(uVar55),ZEXT416((uint)(1.0 - (float)iVar18 * 0.14285715)));
      auVar9 = vfmadd231ss_fma(ZEXT416((uint)(fVar145 * fVar164)),ZEXT416(uVar55),
                               ZEXT416((uint)(1.0 - fVar164)));
      auVar277 = ZEXT1664(auVar9);
      fVar164 = auVar13._0_4_;
      local_458 = auVar9._0_4_;
      fVar145 = local_458 - fVar164;
      local_438._0_16_ = auVar13;
      fStack_454 = auVar9._4_4_;
      fStack_450 = auVar9._8_4_;
      fStack_44c = auVar9._12_4_;
      if (0.16666667 <= fVar145) break;
      auVar273 = vshufps_avx(local_4b8,local_4b8,0x50);
      auVar102._8_4_ = 0x3f800000;
      auVar102._0_8_ = &DAT_3f8000003f800000;
      auVar102._12_4_ = 0x3f800000;
      auVar10 = vsubps_avx(auVar102,auVar273);
      fVar166 = auVar273._0_4_;
      auVar117._0_4_ = fVar127 * fVar166;
      fVar168 = auVar273._4_4_;
      auVar117._4_4_ = fVar128 * fVar168;
      fVar83 = auVar273._8_4_;
      auVar117._8_4_ = fVar127 * fVar83;
      fVar65 = auVar273._12_4_;
      auVar117._12_4_ = fVar128 * fVar65;
      auVar133._0_4_ = fVar260 * fVar166;
      auVar133._4_4_ = fVar270 * fVar168;
      auVar133._8_4_ = fVar260 * fVar83;
      auVar133._12_4_ = fVar270 * fVar65;
      auVar155._0_4_ = fVar227 * fVar166;
      auVar155._4_4_ = fVar238 * fVar168;
      auVar155._8_4_ = fVar227 * fVar83;
      auVar155._12_4_ = fVar238 * fVar65;
      auVar89._0_4_ = fVar113 * fVar166;
      auVar89._4_4_ = fVar126 * fVar168;
      auVar89._8_4_ = fVar113 * fVar83;
      auVar89._12_4_ = fVar126 * fVar65;
      auVar273 = vfmadd231ps_fma(auVar117,auVar10,auVar280);
      auVar98 = vfmadd231ps_fma(auVar133,auVar10,auVar207);
      auVar84 = vfmadd231ps_fma(auVar155,auVar10,auVar88);
      auVar10 = vfmadd231ps_fma(auVar89,auVar101,auVar10);
      auVar112._16_16_ = auVar273;
      auVar112._0_16_ = auVar273;
      auVar124._16_16_ = auVar98;
      auVar124._0_16_ = auVar98;
      auVar143._16_16_ = auVar84;
      auVar143._0_16_ = auVar84;
      auVar183._4_4_ = fVar164;
      auVar183._0_4_ = fVar164;
      auVar183._8_4_ = fVar164;
      auVar183._12_4_ = fVar164;
      auVar183._20_4_ = local_458;
      auVar183._16_4_ = local_458;
      auVar183._24_4_ = local_458;
      auVar183._28_4_ = local_458;
      auVar82 = vsubps_avx(auVar124,auVar112);
      auVar98 = vfmadd213ps_fma(auVar82,auVar183,auVar112);
      auVar82 = vsubps_avx(auVar143,auVar124);
      auVar67 = vfmadd213ps_fma(auVar82,auVar183,auVar124);
      auVar273 = vsubps_avx(auVar10,auVar84);
      auVar125._16_16_ = auVar273;
      auVar125._0_16_ = auVar273;
      auVar273 = vfmadd213ps_fma(auVar125,auVar183,auVar143);
      auVar82 = vsubps_avx(ZEXT1632(auVar67),ZEXT1632(auVar98));
      auVar10 = vfmadd213ps_fma(auVar82,auVar183,ZEXT1632(auVar98));
      auVar82 = vsubps_avx(ZEXT1632(auVar273),ZEXT1632(auVar67));
      auVar273 = vfmadd213ps_fma(auVar82,auVar183,ZEXT1632(auVar67));
      auVar82 = vsubps_avx(ZEXT1632(auVar273),ZEXT1632(auVar10));
      auVar130 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar82,auVar183);
      fVar184 = auVar82._4_4_ * 3.0;
      fVar146 = fVar145 * 0.33333334;
      local_218._0_8_ =
           CONCAT44(auVar130._4_4_ + fVar146 * fVar184,
                    auVar130._0_4_ + fVar146 * auVar82._0_4_ * 3.0);
      local_218._8_4_ = auVar130._8_4_ + fVar146 * auVar82._8_4_ * 3.0;
      local_218._12_4_ = auVar130._12_4_ + fVar146 * auVar82._12_4_ * 3.0;
      auVar10 = vshufpd_avx(auVar130,auVar130,3);
      auVar98 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
      _local_3c8 = auVar10;
      auVar273 = vsubps_avx(auVar10,auVar130);
      _local_3f8 = auVar98;
      auVar84 = vsubps_avx(auVar98,(undefined1  [16])0x0);
      auVar103._0_4_ = auVar273._0_4_ + auVar84._0_4_;
      auVar103._4_4_ = auVar273._4_4_ + auVar84._4_4_;
      auVar103._8_4_ = auVar273._8_4_ + auVar84._8_4_;
      auVar103._12_4_ = auVar273._12_4_ + auVar84._12_4_;
      auVar273 = vshufps_avx(auVar130,auVar130,0xb1);
      auVar84 = vshufps_avx(local_218._0_16_,local_218._0_16_,0xb1);
      auVar262._4_4_ = auVar103._0_4_;
      auVar262._0_4_ = auVar103._0_4_;
      auVar262._8_4_ = auVar103._0_4_;
      auVar262._12_4_ = auVar103._0_4_;
      auVar67 = vshufps_avx(auVar103,auVar103,0x55);
      fVar166 = auVar67._0_4_;
      auVar191._0_4_ = auVar273._0_4_ * fVar166;
      fVar168 = auVar67._4_4_;
      auVar191._4_4_ = auVar273._4_4_ * fVar168;
      fVar83 = auVar67._8_4_;
      auVar191._8_4_ = auVar273._8_4_ * fVar83;
      fVar65 = auVar67._12_4_;
      auVar191._12_4_ = auVar273._12_4_ * fVar65;
      auVar208._0_4_ = auVar84._0_4_ * fVar166;
      auVar208._4_4_ = auVar84._4_4_ * fVar168;
      auVar208._8_4_ = auVar84._8_4_ * fVar83;
      auVar208._12_4_ = auVar84._12_4_ * fVar65;
      auVar210 = vfmadd231ps_fma(auVar191,auVar262,auVar130);
      auVar114 = vfmadd231ps_fma(auVar208,auVar262,local_218._0_16_);
      auVar84 = vshufps_avx(auVar210,auVar210,0xe8);
      auVar67 = vshufps_avx(auVar114,auVar114,0xe8);
      auVar273 = vcmpps_avx(auVar84,auVar67,1);
      uVar55 = vextractps_avx(auVar273,0);
      auVar66 = auVar114;
      if ((uVar55 & 1) == 0) {
        auVar66 = auVar210;
      }
      auVar134._0_4_ = fVar146 * auVar82._16_4_ * 3.0;
      auVar134._4_4_ = fVar146 * fVar184;
      auVar134._8_4_ = fVar146 * auVar82._24_4_ * 3.0;
      auVar134._12_4_ = fVar146 * local_458;
      auVar148 = vsubps_avx((undefined1  [16])0x0,auVar134);
      auVar135 = vshufps_avx(auVar148,auVar148,0xb1);
      auVar129 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
      auVar281._0_4_ = auVar135._0_4_ * fVar166;
      auVar281._4_4_ = auVar135._4_4_ * fVar168;
      auVar281._8_4_ = auVar135._8_4_ * fVar83;
      auVar281._12_4_ = auVar135._12_4_ * fVar65;
      auVar104._0_4_ = auVar129._0_4_ * fVar166;
      auVar104._4_4_ = auVar129._4_4_ * fVar168;
      auVar104._8_4_ = auVar129._8_4_ * fVar83;
      auVar104._12_4_ = auVar129._12_4_ * fVar65;
      auVar149 = vfmadd231ps_fma(auVar281,auVar262,auVar148);
      auVar187 = vfmadd231ps_fma(auVar104,(undefined1  [16])0x0,auVar262);
      auVar129 = vshufps_avx(auVar149,auVar149,0xe8);
      auVar147 = vshufps_avx(auVar187,auVar187,0xe8);
      auVar135 = vcmpps_avx(auVar129,auVar147,1);
      uVar55 = vextractps_avx(auVar135,0);
      auVar202 = auVar187;
      if ((uVar55 & 1) == 0) {
        auVar202 = auVar149;
      }
      auVar66 = vmaxss_avx(auVar202,auVar66);
      auVar84 = vminps_avx(auVar84,auVar67);
      auVar67 = vminps_avx(auVar129,auVar147);
      auVar67 = vminps_avx(auVar84,auVar67);
      auVar273 = vshufps_avx(auVar273,auVar273,0x55);
      auVar273 = vblendps_avx(auVar273,auVar135,2);
      auVar135 = vpslld_avx(auVar273,0x1f);
      auVar273 = vshufpd_avx(auVar114,auVar114,1);
      auVar273 = vinsertps_avx(auVar273,auVar187,0x9c);
      auVar84 = vshufpd_avx(auVar210,auVar210,1);
      auVar84 = vinsertps_avx(auVar84,auVar149,0x9c);
      auVar273 = vblendvps_avx(auVar84,auVar273,auVar135);
      auVar84 = vmovshdup_avx(auVar273);
      auVar273 = vmaxss_avx(auVar84,auVar273);
      fVar83 = auVar67._0_4_;
      auVar84 = vmovshdup_avx(auVar67);
      fVar168 = auVar273._0_4_;
      fVar166 = auVar66._0_4_;
      if ((0.0001 <= fVar83) || (fVar168 <= -0.0001)) {
        auVar210 = vcmpps_avx(auVar84,SUB6416(ZEXT464(0x38d1b717),0),1);
        auVar114 = vcmpps_avx(auVar67,SUB6416(ZEXT464(0x38d1b717),0),1);
        auVar210 = vorps_avx(auVar114,auVar210);
        if ((-0.0001 < fVar166 & auVar210[0]) != 0) goto LAB_016d259c;
        auVar210 = vcmpps_avx(SUB6416(ZEXT464(0xb8d1b717),0),auVar273,5);
        auVar114 = vcmpps_avx(auVar84,SUB6416(ZEXT464(0x38d1b717),0),5);
        auVar210 = vorps_avx(auVar114,auVar210);
        if ((auVar210 & (undefined1  [16])0x1) == (undefined1  [16])0x0) goto LAB_016d259c;
LAB_016d3049:
        bVar45 = true;
      }
      else {
LAB_016d259c:
        auVar114 = vcmpps_avx(auVar67,_DAT_01feba10,1);
        auVar135 = SUB6416(ZEXT864(0),0) << 0x20;
        auVar210 = vcmpss_avx(auVar66,ZEXT816(0) << 0x20,1);
        auVar156._8_4_ = 0x3f800000;
        auVar156._0_8_ = &DAT_3f8000003f800000;
        auVar156._12_4_ = 0x3f800000;
        auVar209._8_4_ = 0xbf800000;
        auVar209._0_8_ = 0xbf800000bf800000;
        auVar209._12_4_ = 0xbf800000;
        auVar210 = vblendvps_avx(auVar156,auVar209,auVar210);
        auVar114 = vblendvps_avx(auVar156,auVar209,auVar114);
        fVar65 = auVar114._0_4_;
        fVar146 = auVar210._0_4_;
        auVar210 = SUB6416(ZEXT864(0),0) << 0x20;
        auVar129 = ZEXT816(0) << 0x20;
        if ((fVar65 == fVar146) && (!NAN(fVar65) && !NAN(fVar146))) {
          auVar210 = SUB6416(ZEXT464(0x7f800000),0);
        }
        if ((fVar65 == fVar146) && (!NAN(fVar65) && !NAN(fVar146))) {
          auVar135 = SUB6416(ZEXT464(0xff800000),0);
        }
        auVar114 = vmovshdup_avx(auVar114);
        fVar184 = auVar114._0_4_;
        if ((fVar65 != fVar184) || (NAN(fVar65) || NAN(fVar184))) {
          fVar65 = auVar84._0_4_;
          if ((fVar65 != fVar83) || (NAN(fVar65) || NAN(fVar83))) {
            auVar105._0_8_ = auVar67._0_8_ ^ 0x8000000080000000;
            auVar105._8_4_ = auVar67._8_4_ ^ 0x80000000;
            auVar105._12_4_ = auVar67._12_4_ ^ 0x80000000;
            auVar136._0_4_ = -fVar83 / (fVar65 - fVar83);
            auVar136._4_12_ = auVar105._4_12_;
            auVar84 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - auVar136._0_4_)),auVar129,auVar136);
            auVar67 = auVar84;
          }
          else {
            auVar84 = SUB6416(ZEXT464(0x7f800000),0);
            if ((fVar83 == 0.0) && (auVar84 = SUB6416(ZEXT464(0x7f800000),0), !NAN(fVar83))) {
              auVar84 = ZEXT816(0);
            }
            auVar67 = SUB6416(ZEXT464(0xff800000),0);
            if ((fVar83 == 0.0) && (auVar67 = SUB6416(ZEXT464(0xff800000),0), !NAN(fVar83))) {
              auVar67 = SUB6416(ZEXT464(0x3f800000),0);
            }
          }
          auVar210 = vminss_avx(auVar210,auVar84);
          auVar135 = vmaxss_avx(auVar67,auVar135);
        }
        auVar273 = vcmpss_avx(auVar273,auVar129,1);
        auVar137._8_4_ = 0x3f800000;
        auVar137._0_8_ = &DAT_3f8000003f800000;
        auVar137._12_4_ = 0x3f800000;
        auVar157._8_4_ = 0xbf800000;
        auVar157._0_8_ = 0xbf800000bf800000;
        auVar157._12_4_ = 0xbf800000;
        auVar273 = vblendvps_avx(auVar137,auVar157,auVar273);
        fVar83 = auVar273._0_4_;
        auVar273 = SUB6416(ZEXT464(0x3f800000),0);
        if ((fVar146 != fVar83) || (NAN(fVar146) || NAN(fVar83))) {
          if ((fVar168 != fVar166) || (NAN(fVar168) || NAN(fVar166))) {
            auVar106._0_8_ = auVar66._0_8_ ^ 0x8000000080000000;
            auVar106._8_4_ = auVar66._8_4_ ^ 0x80000000;
            auVar106._12_4_ = auVar66._12_4_ ^ 0x80000000;
            auVar138._0_4_ = -fVar166 / (fVar168 - fVar166);
            auVar138._4_12_ = auVar106._4_12_;
            auVar84 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - auVar138._0_4_)),auVar129,auVar138);
            auVar67 = auVar84;
          }
          else {
            auVar84 = SUB6416(ZEXT464(0x7f800000),0);
            if ((fVar166 == 0.0) && (auVar84 = SUB6416(ZEXT464(0x7f800000),0), !NAN(fVar166))) {
              auVar84 = ZEXT816(0);
            }
            auVar67 = SUB6416(ZEXT464(0xff800000),0);
            if ((fVar166 == 0.0) && (auVar67 = SUB6416(ZEXT464(0xff800000),0), !NAN(fVar166))) {
              auVar67 = auVar273;
            }
          }
          auVar210 = vminss_avx(auVar210,auVar84);
          auVar135 = vmaxss_avx(auVar67,auVar135);
        }
        if ((fVar184 != fVar83) || (NAN(fVar184) || NAN(fVar83))) {
          auVar210 = vminss_avx(auVar210,auVar273);
          auVar135 = vmaxss_avx(auVar273,auVar135);
        }
        auVar84 = vmaxss_avx(auVar129,auVar210);
        auVar67 = vminss_avx(auVar135,auVar273);
        bVar45 = true;
        if (auVar84._0_4_ <= auVar67._0_4_) {
          auVar84 = vmaxss_avx(auVar129,ZEXT416((uint)(auVar84._0_4_ + -0.1)));
          auVar273 = vminss_avx(ZEXT416((uint)(auVar67._0_4_ + 0.1)),auVar273);
          auVar90._0_8_ = auVar130._0_8_;
          auVar90._8_8_ = auVar90._0_8_;
          auVar211._8_8_ = local_218._0_8_;
          auVar211._0_8_ = local_218._0_8_;
          auVar222._8_8_ = auVar148._0_8_;
          auVar222._0_8_ = auVar148._0_8_;
          auVar67 = vshufpd_avx(local_218._0_16_,local_218._0_16_,3);
          auVar210 = vshufpd_avx(auVar148,auVar148,3);
          auVar114 = vshufps_avx(auVar84,auVar273,0);
          auVar118._8_4_ = 0x3f800000;
          auVar118._0_8_ = &DAT_3f8000003f800000;
          auVar118._12_4_ = 0x3f800000;
          auVar130 = vsubps_avx(auVar118,auVar114);
          local_3c8._0_4_ = auVar10._0_4_;
          local_3c8._4_4_ = auVar10._4_4_;
          fStack_3c0 = auVar10._8_4_;
          fStack_3bc = auVar10._12_4_;
          fVar166 = auVar114._0_4_;
          auVar119._0_4_ = fVar166 * (float)local_3c8._0_4_;
          fVar168 = auVar114._4_4_;
          auVar119._4_4_ = fVar168 * (float)local_3c8._4_4_;
          fVar83 = auVar114._8_4_;
          auVar119._8_4_ = fVar83 * fStack_3c0;
          fVar65 = auVar114._12_4_;
          auVar119._12_4_ = fVar65 * fStack_3bc;
          auVar139._0_4_ = auVar67._0_4_ * fVar166;
          auVar139._4_4_ = auVar67._4_4_ * fVar168;
          auVar139._8_4_ = auVar67._8_4_ * fVar83;
          auVar139._12_4_ = auVar67._12_4_ * fVar65;
          auVar158._0_4_ = auVar210._0_4_ * fVar166;
          auVar158._4_4_ = auVar210._4_4_ * fVar168;
          auVar158._8_4_ = auVar210._8_4_ * fVar83;
          auVar158._12_4_ = auVar210._12_4_ * fVar65;
          local_3f8._0_4_ = auVar98._0_4_;
          local_3f8._4_4_ = auVar98._4_4_;
          uStack_3f0._0_4_ = auVar98._8_4_;
          uStack_3f0._4_4_ = auVar98._12_4_;
          auVar178._0_4_ = fVar166 * (float)local_3f8._0_4_;
          auVar178._4_4_ = fVar168 * (float)local_3f8._4_4_;
          auVar178._8_4_ = fVar83 * (float)uStack_3f0;
          auVar178._12_4_ = fVar65 * uStack_3f0._4_4_;
          auVar67 = vfmadd231ps_fma(auVar119,auVar130,auVar90);
          auVar210 = vfmadd231ps_fma(auVar139,auVar130,auVar211);
          auVar114 = vfmadd231ps_fma(auVar158,auVar130,auVar222);
          auVar130 = vfmadd231ps_fma(auVar178,auVar130,ZEXT816(0));
          auVar10 = vmovshdup_avx(local_4b8);
          auVar135 = vfmadd231ss_fma(ZEXT416((uint)(auVar10._0_4_ * auVar84._0_4_)),local_4b8,
                                     ZEXT416((uint)(1.0 - auVar84._0_4_)));
          auVar129 = vfmadd231ss_fma(ZEXT416((uint)(auVar10._0_4_ * auVar273._0_4_)),local_4b8,
                                     ZEXT416((uint)(1.0 - auVar273._0_4_)));
          fVar166 = 1.0 / fVar145;
          auVar273 = vsubps_avx(auVar210,auVar67);
          auVar192._0_4_ = auVar273._0_4_ * 3.0;
          auVar192._4_4_ = auVar273._4_4_ * 3.0;
          auVar192._8_4_ = auVar273._8_4_ * 3.0;
          auVar192._12_4_ = auVar273._12_4_ * 3.0;
          auVar273 = vsubps_avx(auVar114,auVar210);
          auVar212._0_4_ = auVar273._0_4_ * 3.0;
          auVar212._4_4_ = auVar273._4_4_ * 3.0;
          auVar212._8_4_ = auVar273._8_4_ * 3.0;
          auVar212._12_4_ = auVar273._12_4_ * 3.0;
          auVar273 = vsubps_avx(auVar130,auVar114);
          auVar223._0_4_ = auVar273._0_4_ * 3.0;
          auVar223._4_4_ = auVar273._4_4_ * 3.0;
          auVar223._8_4_ = auVar273._8_4_ * 3.0;
          auVar223._12_4_ = auVar273._12_4_ * 3.0;
          auVar10 = vminps_avx(auVar212,auVar223);
          auVar273 = vmaxps_avx(auVar212,auVar223);
          auVar10 = vminps_avx(auVar192,auVar10);
          auVar273 = vmaxps_avx(auVar192,auVar273);
          auVar98 = vshufpd_avx(auVar10,auVar10,3);
          auVar84 = vshufpd_avx(auVar273,auVar273,3);
          auVar10 = vminps_avx(auVar10,auVar98);
          auVar273 = vmaxps_avx(auVar273,auVar84);
          auVar213._0_4_ = auVar10._0_4_ * fVar166;
          auVar213._4_4_ = auVar10._4_4_ * fVar166;
          auVar213._8_4_ = auVar10._8_4_ * fVar166;
          auVar213._12_4_ = auVar10._12_4_ * fVar166;
          auVar193._0_4_ = fVar166 * auVar273._0_4_;
          auVar193._4_4_ = fVar166 * auVar273._4_4_;
          auVar193._8_4_ = fVar166 * auVar273._8_4_;
          auVar193._12_4_ = fVar166 * auVar273._12_4_;
          fVar166 = 1.0 / (auVar129._0_4_ - auVar135._0_4_);
          auVar273 = vshufpd_avx(auVar67,auVar67,3);
          auVar10 = vshufpd_avx(auVar210,auVar210,3);
          auVar98 = vshufpd_avx(auVar114,auVar114,3);
          auVar84 = vshufpd_avx(auVar130,auVar130,3);
          auVar273 = vsubps_avx(auVar273,auVar67);
          auVar67 = vsubps_avx(auVar10,auVar210);
          auVar210 = vsubps_avx(auVar98,auVar114);
          auVar84 = vsubps_avx(auVar84,auVar130);
          auVar10 = vminps_avx(auVar273,auVar67);
          auVar273 = vmaxps_avx(auVar273,auVar67);
          auVar98 = vminps_avx(auVar210,auVar84);
          auVar98 = vminps_avx(auVar10,auVar98);
          auVar10 = vmaxps_avx(auVar210,auVar84);
          auVar273 = vmaxps_avx(auVar273,auVar10);
          auVar242._0_4_ = fVar166 * auVar98._0_4_;
          auVar242._4_4_ = fVar166 * auVar98._4_4_;
          auVar242._8_4_ = fVar166 * auVar98._8_4_;
          auVar242._12_4_ = fVar166 * auVar98._12_4_;
          auVar233._0_4_ = fVar166 * auVar273._0_4_;
          auVar233._4_4_ = fVar166 * auVar273._4_4_;
          auVar233._8_4_ = fVar166 * auVar273._8_4_;
          auVar233._12_4_ = fVar166 * auVar273._12_4_;
          auVar98 = vinsertps_avx(auVar13,auVar135,0x10);
          auVar84 = vinsertps_avx(auVar9,auVar129,0x10);
          auVar80._0_4_ = (auVar98._0_4_ + auVar84._0_4_) * 0.5;
          auVar80._4_4_ = (auVar98._4_4_ + auVar84._4_4_) * 0.5;
          auVar80._8_4_ = (auVar98._8_4_ + auVar84._8_4_) * 0.5;
          auVar80._12_4_ = (auVar98._12_4_ + auVar84._12_4_) * 0.5;
          auVar120._4_4_ = auVar80._0_4_;
          auVar120._0_4_ = auVar80._0_4_;
          auVar120._8_4_ = auVar80._0_4_;
          auVar120._12_4_ = auVar80._0_4_;
          auVar9 = vfmadd213ps_fma(local_228,auVar120,local_468);
          auVar273 = vfmadd213ps_fma(local_238,auVar120,local_478);
          auVar10 = vfmadd213ps_fma(local_248,auVar120,local_488);
          auVar13 = vsubps_avx(auVar273,auVar9);
          auVar9 = vfmadd213ps_fma(auVar13,auVar120,auVar9);
          auVar13 = vsubps_avx(auVar10,auVar273);
          auVar13 = vfmadd213ps_fma(auVar13,auVar120,auVar273);
          auVar13 = vsubps_avx(auVar13,auVar9);
          auVar9 = vfmadd231ps_fma(auVar9,auVar13,auVar120);
          auVar121._0_8_ = CONCAT44(auVar13._4_4_ * 3.0,auVar13._0_4_ * 3.0);
          auVar121._8_4_ = auVar13._8_4_ * 3.0;
          auVar121._12_4_ = auVar13._12_4_ * 3.0;
          auVar224._8_8_ = auVar9._0_8_;
          auVar224._0_8_ = auVar9._0_8_;
          auVar13 = vshufpd_avx(auVar9,auVar9,3);
          auVar9 = vshufps_avx(auVar80,auVar80,0x55);
          auVar67 = vsubps_avx(auVar13,auVar224);
          auVar114 = vfmadd231ps_fma(auVar224,auVar9,auVar67);
          auVar263._8_8_ = auVar121._0_8_;
          auVar263._0_8_ = auVar121._0_8_;
          auVar13 = vshufpd_avx(auVar121,auVar121,3);
          auVar13 = vsubps_avx(auVar13,auVar263);
          auVar210 = vfmadd213ps_fma(auVar13,auVar9,auVar263);
          auVar9 = vmovshdup_avx(auVar210);
          auVar264._0_8_ = auVar9._0_8_ ^ 0x8000000080000000;
          auVar264._8_4_ = auVar9._8_4_ ^ 0x80000000;
          auVar264._12_4_ = auVar9._12_4_ ^ 0x80000000;
          auVar273 = vmovshdup_avx(auVar67);
          auVar13 = vunpcklps_avx(auVar273,auVar264);
          auVar10 = vshufps_avx(auVar13,auVar264,4);
          auVar282._0_8_ = auVar67._0_8_ ^ 0x8000000080000000;
          auVar282._8_4_ = auVar67._8_4_ ^ 0x80000000;
          auVar282._12_4_ = auVar67._12_4_ ^ 0x80000000;
          auVar13 = vmovlhps_avx(auVar282,auVar210);
          auVar13 = vshufps_avx(auVar13,auVar210,8);
          auVar9 = vfmsub231ss_fma(ZEXT416((uint)(auVar9._0_4_ * auVar67._0_4_)),auVar273,auVar210);
          auVar140._0_4_ = auVar9._0_4_;
          auVar140._4_4_ = auVar140._0_4_;
          auVar140._8_4_ = auVar140._0_4_;
          auVar140._12_4_ = auVar140._0_4_;
          auVar9 = vdivps_avx(auVar10,auVar140);
          auVar273 = vdivps_avx(auVar13,auVar140);
          fVar83 = auVar114._0_4_;
          fVar166 = auVar9._0_4_;
          auVar13 = vshufps_avx(auVar114,auVar114,0x55);
          fVar168 = auVar273._0_4_;
          local_3f8._4_4_ = fVar83 * auVar9._4_4_ + auVar13._4_4_ * auVar273._4_4_;
          local_3f8._0_4_ = fVar83 * fVar166 + auVar13._0_4_ * fVar168;
          uStack_3f0._0_4_ = fVar83 * auVar9._8_4_ + auVar13._8_4_ * auVar273._8_4_;
          uStack_3f0._4_4_ = fVar83 * auVar9._12_4_ + auVar13._12_4_ * auVar273._12_4_;
          auVar67 = vmovshdup_avx(auVar9);
          auVar13 = vinsertps_avx(auVar213,auVar242,0x1c);
          auVar274._0_4_ = auVar67._0_4_ * auVar13._0_4_;
          auVar274._4_4_ = auVar67._4_4_ * auVar13._4_4_;
          auVar274._8_4_ = auVar67._8_4_ * auVar13._8_4_;
          auVar274._12_4_ = auVar67._12_4_ * auVar13._12_4_;
          auVar10 = vinsertps_avx(auVar193,auVar233,0x1c);
          auVar251._0_4_ = auVar67._0_4_ * auVar10._0_4_;
          auVar251._4_4_ = auVar67._4_4_ * auVar10._4_4_;
          auVar251._8_4_ = auVar67._8_4_ * auVar10._8_4_;
          auVar251._12_4_ = auVar67._12_4_ * auVar10._12_4_;
          auVar130 = vminps_avx(auVar274,auVar251);
          auVar114 = vmaxps_avx(auVar251,auVar274);
          auVar67 = vinsertps_avx(auVar242,auVar213,0x4c);
          auVar66 = vmovshdup_avx(auVar273);
          auVar210 = vinsertps_avx(auVar233,auVar193,0x4c);
          auVar234._0_4_ = auVar66._0_4_ * auVar67._0_4_;
          auVar234._4_4_ = auVar66._4_4_ * auVar67._4_4_;
          auVar234._8_4_ = auVar66._8_4_ * auVar67._8_4_;
          auVar234._12_4_ = auVar66._12_4_ * auVar67._12_4_;
          auVar243._0_4_ = auVar66._0_4_ * auVar210._0_4_;
          auVar243._4_4_ = auVar66._4_4_ * auVar210._4_4_;
          auVar243._8_4_ = auVar66._8_4_ * auVar210._8_4_;
          auVar243._12_4_ = auVar66._12_4_ * auVar210._12_4_;
          auVar66 = vminps_avx(auVar234,auVar243);
          auVar91._0_4_ = auVar66._0_4_ + auVar130._0_4_;
          auVar91._4_4_ = auVar66._4_4_ + auVar130._4_4_;
          auVar91._8_4_ = auVar66._8_4_ + auVar130._8_4_;
          auVar91._12_4_ = auVar66._12_4_ + auVar130._12_4_;
          auVar130 = vmaxps_avx(auVar243,auVar234);
          auVar235._0_4_ = auVar114._0_4_ + auVar130._0_4_;
          auVar235._4_4_ = auVar114._4_4_ + auVar130._4_4_;
          auVar235._8_4_ = auVar114._8_4_ + auVar130._8_4_;
          auVar235._12_4_ = auVar114._12_4_ + auVar130._12_4_;
          auVar244._8_8_ = 0x3f80000000000000;
          auVar244._0_8_ = 0x3f80000000000000;
          auVar114 = vsubps_avx(auVar244,auVar235);
          auVar130 = vsubps_avx(auVar244,auVar91);
          auVar66 = vsubps_avx(auVar98,auVar80);
          auVar265._0_4_ = fVar166 * auVar13._0_4_;
          auVar265._4_4_ = fVar166 * auVar13._4_4_;
          auVar265._8_4_ = fVar166 * auVar13._8_4_;
          auVar265._12_4_ = fVar166 * auVar13._12_4_;
          auVar252._0_4_ = fVar166 * auVar10._0_4_;
          auVar252._4_4_ = fVar166 * auVar10._4_4_;
          auVar252._8_4_ = fVar166 * auVar10._8_4_;
          auVar252._12_4_ = fVar166 * auVar10._12_4_;
          auVar10 = vminps_avx(auVar265,auVar252);
          auVar13 = vmaxps_avx(auVar252,auVar265);
          auVar214._0_4_ = fVar168 * auVar67._0_4_;
          auVar214._4_4_ = fVar168 * auVar67._4_4_;
          auVar214._8_4_ = fVar168 * auVar67._8_4_;
          auVar214._12_4_ = fVar168 * auVar67._12_4_;
          auVar194._0_4_ = fVar168 * auVar210._0_4_;
          auVar194._4_4_ = fVar168 * auVar210._4_4_;
          auVar194._8_4_ = fVar168 * auVar210._8_4_;
          auVar194._12_4_ = fVar168 * auVar210._12_4_;
          auVar67 = vminps_avx(auVar214,auVar194);
          auVar266._0_4_ = auVar10._0_4_ + auVar67._0_4_;
          auVar266._4_4_ = auVar10._4_4_ + auVar67._4_4_;
          auVar266._8_4_ = auVar10._8_4_ + auVar67._8_4_;
          auVar266._12_4_ = auVar10._12_4_ + auVar67._12_4_;
          auVar67 = vsubps_avx(auVar84,auVar80);
          auVar10 = vmaxps_avx(auVar194,auVar214);
          fVar83 = auVar66._0_4_;
          auVar215._0_4_ = fVar83 * auVar114._0_4_;
          fVar65 = auVar66._4_4_;
          auVar215._4_4_ = fVar65 * auVar114._4_4_;
          fVar146 = auVar66._8_4_;
          auVar215._8_4_ = fVar146 * auVar114._8_4_;
          fVar184 = auVar66._12_4_;
          auVar215._12_4_ = fVar184 * auVar114._12_4_;
          auVar195._0_4_ = auVar13._0_4_ + auVar10._0_4_;
          auVar195._4_4_ = auVar13._4_4_ + auVar10._4_4_;
          auVar195._8_4_ = auVar13._8_4_ + auVar10._8_4_;
          auVar195._12_4_ = auVar13._12_4_ + auVar10._12_4_;
          auVar253._8_8_ = 0x3f800000;
          auVar253._0_8_ = 0x3f800000;
          auVar13 = vsubps_avx(auVar253,auVar195);
          auVar10 = vsubps_avx(auVar253,auVar266);
          auVar267._0_4_ = fVar83 * auVar130._0_4_;
          auVar267._4_4_ = fVar65 * auVar130._4_4_;
          auVar267._8_4_ = fVar146 * auVar130._8_4_;
          auVar267._12_4_ = fVar184 * auVar130._12_4_;
          fVar144 = auVar67._0_4_;
          auVar236._0_4_ = fVar144 * auVar114._0_4_;
          fVar163 = auVar67._4_4_;
          auVar236._4_4_ = fVar163 * auVar114._4_4_;
          fVar165 = auVar67._8_4_;
          auVar236._8_4_ = fVar165 * auVar114._8_4_;
          fVar167 = auVar67._12_4_;
          auVar236._12_4_ = fVar167 * auVar114._12_4_;
          auVar92._0_4_ = fVar144 * auVar130._0_4_;
          auVar92._4_4_ = fVar163 * auVar130._4_4_;
          auVar92._8_4_ = fVar165 * auVar130._8_4_;
          auVar92._12_4_ = fVar167 * auVar130._12_4_;
          auVar283._0_4_ = fVar83 * auVar13._0_4_;
          auVar283._4_4_ = fVar65 * auVar13._4_4_;
          auVar283._8_4_ = fVar146 * auVar13._8_4_;
          auVar283._12_4_ = fVar184 * auVar13._12_4_;
          auVar245._0_4_ = fVar83 * auVar10._0_4_;
          auVar245._4_4_ = fVar65 * auVar10._4_4_;
          auVar245._8_4_ = fVar146 * auVar10._8_4_;
          auVar245._12_4_ = fVar184 * auVar10._12_4_;
          auVar196._0_4_ = fVar144 * auVar13._0_4_;
          auVar196._4_4_ = fVar163 * auVar13._4_4_;
          auVar196._8_4_ = fVar165 * auVar13._8_4_;
          auVar196._12_4_ = fVar167 * auVar13._12_4_;
          auVar254._0_4_ = fVar144 * auVar10._0_4_;
          auVar254._4_4_ = fVar163 * auVar10._4_4_;
          auVar254._8_4_ = fVar165 * auVar10._8_4_;
          auVar254._12_4_ = fVar167 * auVar10._12_4_;
          auVar13 = vminps_avx(auVar283,auVar245);
          auVar10 = vminps_avx(auVar196,auVar254);
          auVar13 = vminps_avx(auVar13,auVar10);
          auVar10 = vmaxps_avx(auVar245,auVar283);
          auVar67 = vminps_avx(auVar215,auVar267);
          auVar210 = vminps_avx(auVar236,auVar92);
          auVar67 = vminps_avx(auVar67,auVar210);
          auVar13 = vhaddps_avx(auVar13,auVar67);
          auVar67 = vmaxps_avx(auVar254,auVar196);
          auVar10 = vmaxps_avx(auVar67,auVar10);
          auVar67 = vmaxps_avx(auVar267,auVar215);
          auVar210 = vmaxps_avx(auVar92,auVar236);
          auVar67 = vmaxps_avx(auVar210,auVar67);
          auVar10 = vhaddps_avx(auVar10,auVar67);
          auVar67 = vshufps_avx(auVar80,auVar80,0x54);
          auVar67 = vsubps_avx(auVar67,_local_3f8);
          auVar13 = vshufps_avx(auVar13,auVar13,0xe8);
          auVar10 = vshufps_avx(auVar10,auVar10,0xe8);
          auVar216._0_4_ = auVar67._0_4_ + auVar13._0_4_;
          auVar216._4_4_ = auVar67._4_4_ + auVar13._4_4_;
          auVar216._8_4_ = auVar67._8_4_ + auVar13._8_4_;
          auVar216._12_4_ = auVar67._12_4_ + auVar13._12_4_;
          auVar197._0_4_ = auVar67._0_4_ + auVar10._0_4_;
          auVar197._4_4_ = auVar67._4_4_ + auVar10._4_4_;
          auVar197._8_4_ = auVar67._8_4_ + auVar10._8_4_;
          auVar197._12_4_ = auVar67._12_4_ + auVar10._12_4_;
          auVar13 = vmaxps_avx(auVar98,auVar216);
          auVar10 = vminps_avx(auVar197,auVar84);
          auVar13 = vcmpps_avx(auVar10,auVar13,1);
          auVar13 = vshufps_avx(auVar13,auVar13,0x50);
          local_4b8 = vinsertps_avx(auVar135,ZEXT416((uint)auVar129._0_4_),0x10);
          if ((auVar13 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
              auVar13[0xf] < '\0') goto LAB_016d3049;
          bVar61 = 0;
          if ((fVar164 < auVar216._0_4_) && (auVar197._0_4_ < auVar84._0_4_)) {
            auVar10 = vmovshdup_avx(auVar216);
            auVar13 = vcmpps_avx(auVar197,auVar84,1);
            bVar61 = auVar13[4] & auVar135._0_4_ < auVar10._0_4_;
          }
          if (((3 < (uint)uVar57 || fVar145 < 0.001) | bVar61) == 1) {
            lVar59 = 200;
            do {
              fVar65 = auVar67._0_4_;
              fVar83 = 1.0 - fVar65;
              fVar145 = fVar83 * fVar83 * fVar83;
              fVar164 = fVar65 * 3.0 * fVar83 * fVar83;
              fVar83 = fVar83 * fVar65 * fVar65 * 3.0;
              auVar159._4_4_ = fVar145;
              auVar159._0_4_ = fVar145;
              auVar159._8_4_ = fVar145;
              auVar159._12_4_ = fVar145;
              auVar107._4_4_ = fVar164;
              auVar107._0_4_ = fVar164;
              auVar107._8_4_ = fVar164;
              auVar107._12_4_ = fVar164;
              auVar93._4_4_ = fVar83;
              auVar93._0_4_ = fVar83;
              auVar93._8_4_ = fVar83;
              auVar93._12_4_ = fVar83;
              fVar65 = fVar65 * fVar65 * fVar65;
              auVar179._0_4_ = (float)local_258._0_4_ * fVar65;
              auVar179._4_4_ = (float)local_258._4_4_ * fVar65;
              auVar179._8_4_ = fStack_250 * fVar65;
              auVar179._12_4_ = fStack_24c * fVar65;
              auVar13 = vfmadd231ps_fma(auVar179,local_488,auVar93);
              auVar13 = vfmadd231ps_fma(auVar13,local_478,auVar107);
              auVar13 = vfmadd231ps_fma(auVar13,local_468,auVar159);
              auVar94._8_8_ = auVar13._0_8_;
              auVar94._0_8_ = auVar13._0_8_;
              auVar13 = vshufpd_avx(auVar13,auVar13,3);
              auVar10 = vshufps_avx(auVar67,auVar67,0x55);
              auVar13 = vsubps_avx(auVar13,auVar94);
              auVar10 = vfmadd213ps_fma(auVar13,auVar10,auVar94);
              fVar145 = auVar10._0_4_;
              auVar13 = vshufps_avx(auVar10,auVar10,0x55);
              auVar95._0_4_ = fVar166 * fVar145 + fVar168 * auVar13._0_4_;
              auVar95._4_4_ = auVar9._4_4_ * fVar145 + auVar273._4_4_ * auVar13._4_4_;
              auVar95._8_4_ = auVar9._8_4_ * fVar145 + auVar273._8_4_ * auVar13._8_4_;
              auVar95._12_4_ = auVar9._12_4_ * fVar145 + auVar273._12_4_ * auVar13._12_4_;
              auVar67 = vsubps_avx(auVar67,auVar95);
              auVar13 = vandps_avx(local_338,auVar10);
              auVar10 = vshufps_avx(auVar13,auVar13,0xf5);
              auVar13 = vmaxss_avx(auVar10,auVar13);
              if (auVar13._0_4_ < (float)local_418._0_4_) {
                fVar145 = auVar67._0_4_;
                if ((0.0 <= fVar145) && (fVar145 <= 1.0)) {
                  auVar13 = vmovshdup_avx(auVar67);
                  fVar164 = auVar13._0_4_;
                  if ((0.0 <= fVar164) && (fVar164 <= 1.0)) {
                    auVar13 = vinsertps_avx(ZEXT416((uint)(pre->ray_space).vx.field_0.m128[2]),
                                            ZEXT416((uint)(pre->ray_space).vy.field_0.m128[2]),0x1c)
                    ;
                    auVar114 = vinsertps_avx(auVar13,ZEXT416((uint)(pre->ray_space).vz.field_0.m128
                                                                   [2]),0x28);
                    aVar2 = (ray->super_RayK<1>).org.field_0;
                    auVar13 = vsubps_avx(local_348,(undefined1  [16])aVar2);
                    auVar13 = vdpps_avx(auVar13,auVar114,0x7f);
                    auVar9 = vsubps_avx(local_378,(undefined1  [16])aVar2);
                    auVar9 = vdpps_avx(auVar9,auVar114,0x7f);
                    auVar273 = vsubps_avx(local_388,(undefined1  [16])aVar2);
                    auVar273 = vdpps_avx(auVar273,auVar114,0x7f);
                    auVar10 = vsubps_avx(local_368,(undefined1  [16])aVar2);
                    auVar10 = vdpps_avx(auVar10,auVar114,0x7f);
                    auVar98 = vsubps_avx(_local_358,(undefined1  [16])aVar2);
                    auVar98 = vdpps_avx(auVar98,auVar114,0x7f);
                    auVar84 = vsubps_avx(_local_398,(undefined1  [16])aVar2);
                    auVar84 = vdpps_avx(auVar84,auVar114,0x7f);
                    auVar210 = vsubps_avx(_local_3a8,(undefined1  [16])aVar2);
                    auVar210 = vdpps_avx(auVar210,auVar114,0x7f);
                    auVar50._4_4_ = fStack_3d4;
                    auVar50._0_4_ = local_3d8;
                    auVar50._8_4_ = fStack_3d0;
                    auVar50._12_4_ = fStack_3cc;
                    auVar130 = vsubps_avx(auVar50,(undefined1  [16])aVar2);
                    auVar114 = vdpps_avx(auVar130,auVar114,0x7f);
                    fVar166 = 1.0 - fVar164;
                    auVar13 = vfmadd231ss_fma(ZEXT416((uint)(auVar98._0_4_ * fVar164)),
                                              ZEXT416((uint)fVar166),auVar13);
                    auVar9 = vfmadd231ss_fma(ZEXT416((uint)(auVar84._0_4_ * fVar164)),
                                             ZEXT416((uint)fVar166),auVar9);
                    auVar273 = vfmadd231ss_fma(ZEXT416((uint)(auVar210._0_4_ * fVar164)),
                                               ZEXT416((uint)fVar166),auVar273);
                    auVar10 = vfmadd231ss_fma(ZEXT416((uint)(fVar164 * auVar114._0_4_)),
                                              ZEXT416((uint)fVar166),auVar10);
                    fVar83 = 1.0 - fVar145;
                    fVar164 = fVar83 * fVar145 * fVar145 * 3.0;
                    fVar146 = fVar145 * fVar145 * fVar145;
                    auVar273 = vfmadd231ss_fma(ZEXT416((uint)(auVar10._0_4_ * fVar146)),
                                               ZEXT416((uint)fVar164),auVar273);
                    fVar166 = fVar145 * 3.0 * fVar83 * fVar83;
                    auVar9 = vfmadd231ss_fma(auVar273,ZEXT416((uint)fVar166),auVar9);
                    fVar168 = fVar83 * fVar83 * fVar83;
                    auVar13 = vfmadd231ss_fma(auVar9,ZEXT416((uint)fVar168),auVar13);
                    fVar65 = auVar13._0_4_;
                    if ((ray->super_RayK<1>).org.field_0.m128[3] <= fVar65) {
                      fVar184 = (ray->super_RayK<1>).tfar;
                      local_3f8._0_4_ = fVar184;
                      if ((fVar65 <= fVar184) &&
                         (pGVar5 = (context->scene->geometries).items[uVar54].ptr,
                         (pGVar5->mask & (ray->super_RayK<1>).mask) != 0)) {
                        auVar13 = vshufps_avx(auVar67,auVar67,0x55);
                        auVar217._8_4_ = 0x3f800000;
                        auVar217._0_8_ = &DAT_3f8000003f800000;
                        auVar217._12_4_ = 0x3f800000;
                        auVar9 = vsubps_avx(auVar217,auVar13);
                        fVar184 = auVar13._0_4_;
                        auVar225._0_4_ = fVar184 * (float)local_358._0_4_;
                        fVar144 = auVar13._4_4_;
                        auVar225._4_4_ = fVar144 * (float)local_358._4_4_;
                        fVar163 = auVar13._8_4_;
                        auVar225._8_4_ = fVar163 * fStack_350;
                        fVar165 = auVar13._12_4_;
                        auVar225._12_4_ = fVar165 * fStack_34c;
                        auVar237._0_4_ = fVar184 * (float)local_398._0_4_;
                        auVar237._4_4_ = fVar144 * (float)local_398._4_4_;
                        auVar237._8_4_ = fVar163 * fStack_390;
                        auVar237._12_4_ = fVar165 * fStack_38c;
                        auVar246._0_4_ = fVar184 * (float)local_3a8._0_4_;
                        auVar246._4_4_ = fVar144 * (float)local_3a8._4_4_;
                        auVar246._8_4_ = fVar163 * fStack_3a0;
                        auVar246._12_4_ = fVar165 * fStack_39c;
                        auVar198._0_4_ = fVar184 * local_3d8;
                        auVar198._4_4_ = fVar144 * fStack_3d4;
                        auVar198._8_4_ = fVar163 * fStack_3d0;
                        auVar198._12_4_ = fVar165 * fStack_3cc;
                        auVar13 = vfmadd231ps_fma(auVar225,auVar9,local_348);
                        auVar273 = vfmadd231ps_fma(auVar237,auVar9,local_378);
                        auVar10 = vfmadd231ps_fma(auVar246,auVar9,local_388);
                        auVar98 = vfmadd231ps_fma(auVar198,auVar9,local_368);
                        auVar13 = vsubps_avx(auVar273,auVar13);
                        auVar9 = vsubps_avx(auVar10,auVar273);
                        auVar273 = vsubps_avx(auVar98,auVar10);
                        auVar247._0_4_ = fVar145 * auVar9._0_4_;
                        auVar247._4_4_ = fVar145 * auVar9._4_4_;
                        auVar247._8_4_ = fVar145 * auVar9._8_4_;
                        auVar247._12_4_ = fVar145 * auVar9._12_4_;
                        auVar180._4_4_ = fVar83;
                        auVar180._0_4_ = fVar83;
                        auVar180._8_4_ = fVar83;
                        auVar180._12_4_ = fVar83;
                        auVar13 = vfmadd231ps_fma(auVar247,auVar180,auVar13);
                        auVar199._0_4_ = fVar145 * auVar273._0_4_;
                        auVar199._4_4_ = fVar145 * auVar273._4_4_;
                        auVar199._8_4_ = fVar145 * auVar273._8_4_;
                        auVar199._12_4_ = fVar145 * auVar273._12_4_;
                        auVar9 = vfmadd231ps_fma(auVar199,auVar180,auVar9);
                        auVar200._0_4_ = fVar145 * auVar9._0_4_;
                        auVar200._4_4_ = fVar145 * auVar9._4_4_;
                        auVar200._8_4_ = fVar145 * auVar9._8_4_;
                        auVar200._12_4_ = fVar145 * auVar9._12_4_;
                        auVar9 = vfmadd231ps_fma(auVar200,auVar180,auVar13);
                        auVar160._0_4_ = fVar146 * (float)local_2a8._0_4_;
                        auVar160._4_4_ = fVar146 * (float)local_2a8._4_4_;
                        auVar160._8_4_ = fVar146 * fStack_2a0;
                        auVar160._12_4_ = fVar146 * fStack_29c;
                        auVar108._4_4_ = fVar164;
                        auVar108._0_4_ = fVar164;
                        auVar108._8_4_ = fVar164;
                        auVar108._12_4_ = fVar164;
                        auVar13 = vfmadd132ps_fma(auVar108,auVar160,local_298);
                        auVar141._4_4_ = fVar166;
                        auVar141._0_4_ = fVar166;
                        auVar141._8_4_ = fVar166;
                        auVar141._12_4_ = fVar166;
                        auVar13 = vfmadd132ps_fma(auVar141,auVar13,local_288);
                        auVar161._0_4_ = auVar9._0_4_ * 3.0;
                        auVar161._4_4_ = auVar9._4_4_ * 3.0;
                        auVar161._8_4_ = auVar9._8_4_ * 3.0;
                        auVar161._12_4_ = auVar9._12_4_ * 3.0;
                        auVar122._4_4_ = fVar168;
                        auVar122._0_4_ = fVar168;
                        auVar122._8_4_ = fVar168;
                        auVar122._12_4_ = fVar168;
                        auVar9 = vfmadd132ps_fma(auVar122,auVar13,local_278);
                        auVar13 = vshufps_avx(auVar161,auVar161,0xc9);
                        auVar109._0_4_ = auVar9._0_4_ * auVar13._0_4_;
                        auVar109._4_4_ = auVar9._4_4_ * auVar13._4_4_;
                        auVar109._8_4_ = auVar9._8_4_ * auVar13._8_4_;
                        auVar109._12_4_ = auVar9._12_4_ * auVar13._12_4_;
                        auVar13 = vshufps_avx(auVar9,auVar9,0xc9);
                        auVar13 = vfmsub231ps_fma(auVar109,auVar161,auVar13);
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                          (ray->super_RayK<1>).tfar = fVar65;
                          auVar9 = vshufps_avx(auVar13,auVar13,0xe9);
                          uVar169 = vmovlps_avx(auVar9);
                          *(undefined8 *)&(ray->Ng).field_0 = uVar169;
                          (ray->Ng).field_0.field_0.z = auVar13._0_4_;
                          uVar169 = vmovlps_avx(auVar67);
                          ray->u = (float)(int)uVar169;
                          ray->v = (float)(int)((ulong)uVar169 >> 0x20);
                          ray->primID = (uint)local_400;
                          ray->geomID = uVar54;
                          ray->instID[0] = context->user->instID[0];
                          ray->instPrimID[0] = context->user->instPrimID[0];
                        }
                        else {
                          auVar9 = vshufps_avx(auVar13,auVar13,0xe9);
                          local_2e8 = vmovlps_avx(auVar9);
                          local_2e0 = auVar13._0_4_;
                          local_2dc = vmovlps_avx(auVar67);
                          local_2d4 = (uint)local_400;
                          local_2d0 = uVar54;
                          local_2cc = context->user->instID[0];
                          local_2c8 = context->user->instPrimID[0];
                          (ray->super_RayK<1>).tfar = fVar65;
                          local_48c = -1;
                          local_328.valid = &local_48c;
                          local_328.geometryUserPtr = pGVar5->userPtr;
                          local_328.context = context->user;
                          local_328.ray = (RTCRayN *)ray;
                          local_328.hit = (RTCHitN *)&local_2e8;
                          local_328.N = 1;
                          if ((pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                             ((*pGVar5->intersectionFilterN)(&local_328), *local_328.valid != 0)) {
                            p_Var6 = context->args->filter;
                            if (p_Var6 != (RTCFilterFunctionN)0x0) {
                              if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER
                                   ) != RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                                 (((pGVar5->field_8).field_0x2 & 0x40) != 0)) {
                                (*p_Var6)(&local_328);
                              }
                              if (*local_328.valid == 0) goto LAB_016d3275;
                            }
                            (((Vec3f *)((long)local_328.ray + 0x30))->field_0).components[0] =
                                 *(float *)local_328.hit;
                            (((Vec3f *)((long)local_328.ray + 0x30))->field_0).field_0.y =
                                 *(float *)(local_328.hit + 4);
                            (((Vec3f *)((long)local_328.ray + 0x30))->field_0).field_0.z =
                                 *(float *)(local_328.hit + 8);
                            *(float *)((long)local_328.ray + 0x3c) = *(float *)(local_328.hit + 0xc)
                            ;
                            *(float *)((long)local_328.ray + 0x40) =
                                 *(float *)(local_328.hit + 0x10);
                            *(float *)((long)local_328.ray + 0x44) =
                                 *(float *)(local_328.hit + 0x14);
                            *(float *)((long)local_328.ray + 0x48) =
                                 *(float *)(local_328.hit + 0x18);
                            *(float *)((long)local_328.ray + 0x4c) =
                                 *(float *)(local_328.hit + 0x1c);
                            *(float *)((long)local_328.ray + 0x50) =
                                 *(float *)(local_328.hit + 0x20);
                          }
                          else {
LAB_016d3275:
                            (ray->super_RayK<1>).tfar = (float)local_3f8._0_4_;
                          }
                        }
                      }
                    }
                  }
                }
                break;
              }
              lVar59 = lVar59 + -1;
            } while (lVar59 != 0);
          }
          else {
            bVar45 = false;
          }
        }
      }
      auVar277 = ZEXT464(0x3f800000);
      auVar13 = local_438._0_16_;
    } while (bVar45);
    local_438._0_16_ = auVar13;
    local_268 = vinsertps_avx(local_438._0_16_,ZEXT416((uint)local_458),0x10);
  } while( true );
}

Assistant:

static __forceinline void intersect_n(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          
          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }